

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer-a3.cpp
# Opt level: O0

void __thiscall
RasterizerA3<16u>::_renderImpl<CompositorSIMD,true>(RasterizerA3<16u> *this,uint32_t argb32)

{
  int iVar1;
  uint uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  size_t sVar5;
  longlong lVar6;
  undefined8 uVar7;
  longlong lVar8;
  longlong lVar9;
  longlong lVar10;
  longlong lVar11;
  undefined8 uVar12;
  undefined4 uVar13;
  uint7 uVar14;
  uint7 uVar15;
  undefined4 uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  longlong lVar51;
  longlong lVar52;
  ulong uVar53;
  undefined4 uVar54;
  uint32_t uVar55;
  uint32_t uVar56;
  uchar *puVar57;
  intptr_t iVar58;
  unsigned_long uVar59;
  ulong uVar60;
  unsigned_long uVar61;
  unsigned_long uVar62;
  unsigned_long *puVar63;
  long lVar64;
  ushort uVar65;
  short sVar67;
  short sVar68;
  short sVar69;
  short sVar70;
  ulong uVar71;
  short sVar77;
  short sVar82;
  short sVar83;
  short sVar84;
  short sVar85;
  short sVar86;
  short sVar101;
  int iVar106;
  short sVar114;
  undefined1 auVar73 [16];
  short sVar78;
  short sVar87;
  short sVar88;
  short sVar89;
  short sVar94;
  short sVar95;
  short sVar96;
  short sVar97;
  short sVar102;
  short sVar103;
  short sVar104;
  ulong uVar107;
  short sVar108;
  short sVar109;
  short sVar110;
  short sVar111;
  short sVar115;
  short sVar116;
  short sVar117;
  short sVar121;
  short sVar122;
  short sVar123;
  short sVar124;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  short sVar66;
  ushort uVar79;
  ushort uVar90;
  int iVar93;
  ushort uVar98;
  ulong uVar72;
  short sVar80;
  short sVar81;
  short sVar91;
  short sVar92;
  short sVar99;
  short sVar100;
  short sVar105;
  short sVar112;
  short sVar113;
  short sVar118;
  short sVar119;
  int iVar120;
  short sVar125;
  short sVar126;
  undefined1 auVar76 [16];
  undefined1 auVar127 [16];
  undefined8 local_2f28;
  undefined8 uStack_2f20;
  undefined8 local_2ee8;
  undefined8 uStack_2ee0;
  undefined8 local_2ec8;
  undefined8 uStack_2ec0;
  longlong local_2ea8;
  longlong lStack_2ea0;
  undefined8 local_2e48;
  undefined8 uStack_2e40;
  undefined8 local_2dc8;
  undefined8 uStack_2dc0;
  undefined8 local_2da8;
  undefined8 uStack_2da0;
  longlong local_2d88;
  longlong lStack_2d80;
  longlong local_2d68;
  longlong lStack_2d60;
  undefined8 local_2cc8;
  undefined8 uStack_2cc0;
  undefined8 local_2cb8;
  undefined8 uStack_2cb0;
  undefined8 local_2bc8;
  undefined8 uStack_2bc0;
  undefined8 local_2b68;
  undefined8 uStack_2b60;
  longlong local_2ae8;
  longlong lStack_2ae0;
  undefined8 local_2ac8;
  undefined8 uStack_2ac0;
  undefined8 local_2a28;
  undefined8 uStack_2a20;
  undefined8 local_29b8;
  undefined8 uStack_29b0;
  undefined8 local_29a8;
  undefined8 uStack_29a0;
  undefined8 local_2928;
  undefined8 local_28a8;
  undefined8 uStack_28a0;
  undefined8 local_2868;
  undefined8 uStack_2860;
  undefined8 local_2848;
  undefined8 uStack_2840;
  longlong local_2828;
  longlong lStack_2820;
  undefined8 local_27c8;
  undefined8 uStack_27c0;
  undefined8 local_2748;
  undefined8 uStack_2740;
  undefined8 local_2728;
  undefined8 uStack_2720;
  longlong local_2708;
  longlong lStack_2700;
  longlong local_26e8;
  longlong lStack_26e0;
  undefined8 local_2648;
  undefined8 uStack_2640;
  undefined8 local_2638;
  undefined8 uStack_2630;
  undefined8 local_2558;
  undefined8 uStack_2550;
  unsigned_long uStack_2518;
  uint32_t mask_1;
  unsigned_long local_2510;
  uint local_2504;
  unsigned_long uStack_2500;
  uint32_t mask;
  size_t x1;
  BitWordFlipIterator<unsigned_long> it;
  size_t xOffset;
  size_t x0;
  int cover;
  uint32_t *dstPix;
  Cell *cell;
  size_t nBits;
  CompositorSIMD compositor;
  Cell *cellLine;
  BitWord *bitPtr;
  size_t y1;
  size_t y0;
  intptr_t dstStride;
  uint8_t *dstLine;
  uint32_t argb32_local;
  RasterizerA3<16U> *this_local;
  uint32_t index_1;
  unsigned_long bitWord_1;
  uint32_t index;
  unsigned_long bitWord;
  uint local_23c0;
  uint local_23bc;
  undefined8 uStack_23b8;
  I128 s0_7;
  I128 s1_4;
  I128 s0_6;
  I128 s3_1;
  I128 s2_1;
  I128 s1_3;
  I128 s0_5;
  I128 mInv_1;
  I128 mPix_1;
  undefined4 local_2318;
  short sStack_2308;
  short sStack_2306;
  I128 mVal_1;
  size_t i_2;
  size_t local_22e0;
  undefined8 uStack_22c8;
  I128 s0_2;
  I128 s1_1;
  I128 s0_1;
  I128 s3;
  I128 s2;
  I128 s1;
  I128 s0;
  I128 mInv;
  I128 mPix;
  undefined4 local_2228;
  short sStack_2218;
  short sStack_2216;
  I128 mVal;
  size_t i;
  size_t local_21f0;
  ulong uStack_21d8;
  I128 t0_1;
  I128 s0_4;
  I128 m0_1;
  I128 t1;
  I128 t0;
  I128 s1_2;
  I128 s0_3;
  I128 m1;
  I128 m0;
  ulong local_2140;
  size_t i_1;
  I128 coverXmm;
  size_t local_2108;
  ulong local_2008;
  undefined8 local_19c8;
  undefined8 uStack_19c0;
  longlong *local_19b0;
  undefined1 *local_19a8;
  longlong *local_19a0;
  undefined8 local_1998;
  undefined8 uStack_1990;
  longlong *local_1980;
  undefined1 *local_1978;
  longlong *local_1970;
  undefined8 local_1968;
  undefined8 uStack_1960;
  longlong *local_1950;
  undefined1 *local_1948;
  longlong *local_1940;
  undefined8 local_1938;
  undefined8 uStack_1930;
  longlong *local_1920;
  undefined1 *local_1918;
  longlong *local_1910;
  undefined8 local_1908;
  undefined8 uStack_1900;
  longlong *local_18f0;
  undefined1 *local_18e8;
  longlong *local_18e0;
  undefined8 local_18d8;
  undefined8 uStack_18d0;
  longlong *local_18c0;
  undefined1 *local_18b8;
  longlong *local_18b0;
  undefined8 local_18a8;
  undefined8 uStack_18a0;
  longlong *local_1890;
  undefined1 *local_1888;
  longlong *local_1880;
  undefined8 local_1878;
  undefined8 uStack_1870;
  longlong *local_1860;
  undefined1 *local_1858;
  longlong *local_1850;
  undefined8 local_1848;
  undefined8 uStack_1840;
  longlong *local_1830;
  undefined1 *local_1828;
  longlong *local_1820;
  undefined8 local_1818;
  undefined8 uStack_1810;
  undefined8 *local_1800;
  undefined1 *local_17f8;
  undefined8 *local_17f0;
  undefined8 local_17e8;
  undefined8 uStack_17e0;
  longlong *local_17d0;
  undefined1 *local_17c8;
  longlong *local_17c0;
  undefined8 local_17b8;
  undefined8 uStack_17b0;
  longlong *local_17a0;
  undefined1 *local_1798;
  longlong *local_1790;
  undefined8 local_1788;
  undefined8 uStack_1780;
  longlong *local_1770;
  undefined1 *local_1768;
  longlong *local_1760;
  undefined8 local_1758;
  undefined8 uStack_1750;
  longlong *local_1740;
  undefined1 *local_1738;
  longlong *local_1730;
  undefined8 local_1728;
  undefined8 uStack_1720;
  longlong *local_1710;
  undefined1 *local_1708;
  longlong *local_1700;
  undefined8 local_16f8;
  undefined8 uStack_16f0;
  longlong *local_16e0;
  undefined1 *local_16d8;
  longlong *local_16d0;
  undefined8 local_16c8;
  undefined8 uStack_16c0;
  undefined8 *local_16b8;
  undefined1 *local_16b0;
  undefined8 *local_16a8;
  longlong *local_16a0;
  longlong *local_1698;
  longlong *local_1690;
  longlong *local_1688;
  longlong *local_1680;
  longlong *local_1678;
  longlong *local_1670;
  longlong *local_1668;
  longlong *local_1660;
  longlong *local_1658;
  undefined8 *local_1650;
  undefined8 *local_1648;
  longlong *local_1640;
  longlong *local_1638;
  longlong *local_1630;
  longlong *local_1628;
  longlong *local_1620;
  longlong *local_1618;
  undefined8 *local_1610;
  undefined8 *local_1608;
  uint *local_1600;
  undefined1 local_15f8 [16];
  uint local_15e4;
  uint *local_15e0;
  undefined1 local_15d8 [16];
  uint local_15c4;
  uint *local_15c0;
  undefined1 local_15b8 [16];
  uint local_15a4;
  uint *local_15a0;
  undefined1 local_1598 [16];
  uint local_1584;
  uint *local_1580;
  undefined1 local_1578 [16];
  uint local_155c;
  longlong local_1558;
  longlong lStack_1550;
  longlong *local_1540;
  longlong local_1538;
  longlong lStack_1530;
  longlong *local_1520;
  longlong local_1518;
  longlong lStack_1510;
  longlong *local_1500;
  undefined8 local_14f8;
  undefined8 uStack_14f0;
  undefined8 *local_14e0;
  undefined8 local_14d8;
  undefined8 uStack_14d0;
  undefined8 *local_14c0;
  undefined8 local_14b8;
  undefined8 uStack_14b0;
  undefined8 *local_14a0;
  undefined8 local_1498;
  undefined8 uStack_1490;
  undefined8 *local_1480;
  undefined8 local_1478;
  undefined8 uStack_1470;
  undefined8 *local_1460;
  undefined8 local_1458;
  undefined8 uStack_1450;
  undefined8 *local_1440;
  undefined8 local_1438;
  undefined8 uStack_1430;
  undefined8 *local_1420;
  undefined8 local_1418;
  undefined8 uStack_1410;
  undefined8 *local_1400;
  undefined8 local_13f8;
  undefined8 uStack_13f0;
  undefined8 *local_13e0;
  longlong local_13d8;
  longlong lStack_13d0;
  longlong *local_13c0;
  longlong local_13b8;
  longlong lStack_13b0;
  longlong *local_13a0;
  longlong local_1398;
  longlong lStack_1390;
  longlong *local_1380;
  undefined8 local_1378;
  undefined8 uStack_1370;
  undefined8 *local_1360;
  undefined8 local_1358;
  undefined8 uStack_1350;
  undefined8 *local_1340;
  undefined8 local_1338;
  undefined8 uStack_1330;
  undefined8 *local_1320;
  undefined8 local_1318;
  undefined8 uStack_1310;
  undefined8 *local_1300;
  undefined8 local_12f8;
  undefined8 uStack_12f0;
  undefined8 *local_12e0;
  undefined8 local_12d8;
  undefined8 uStack_12d0;
  undefined8 *local_12c0;
  undefined8 local_12b8;
  undefined8 uStack_12b0;
  undefined8 *local_12a0;
  undefined8 local_1298;
  undefined8 uStack_1290;
  undefined8 *local_1280;
  undefined8 local_1278;
  undefined8 uStack_1270;
  undefined8 *local_1260;
  undefined8 local_1258;
  undefined8 uStack_1250;
  undefined8 *local_1240;
  undefined8 local_1238;
  undefined8 uStack_1230;
  undefined8 *local_1220;
  longlong local_1218;
  longlong lStack_1210;
  longlong *local_1200;
  undefined8 local_11f8;
  longlong lStack_11f0;
  undefined8 local_11e8;
  longlong lStack_11e0;
  undefined8 local_11d8;
  undefined8 uStack_11d0;
  undefined8 local_11c8;
  undefined8 uStack_11c0;
  undefined8 local_11b8;
  longlong lStack_11b0;
  undefined8 local_11a8;
  longlong lStack_11a0;
  undefined8 local_1198;
  undefined8 uStack_1190;
  undefined8 local_1188;
  undefined8 uStack_1180;
  longlong local_1178;
  longlong lStack_1170;
  longlong local_1168;
  longlong lStack_1160;
  undefined8 local_1158;
  undefined8 uStack_1150;
  undefined8 local_1148;
  undefined8 uStack_1140;
  ulong local_1138;
  ulong uStack_1130;
  undefined8 local_1128;
  undefined8 uStack_1120;
  ulong local_1118;
  ulong uStack_1110;
  undefined8 local_1108;
  undefined8 uStack_1100;
  ulong local_10f8;
  ulong uStack_10f0;
  undefined8 local_10e8;
  undefined8 uStack_10e0;
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  ulong local_10b8;
  ulong uStack_10b0;
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  ulong local_1098;
  ulong uStack_1090;
  undefined8 local_1088;
  undefined8 uStack_1080;
  ulong local_1078;
  ulong uStack_1070;
  undefined8 local_1068;
  undefined8 uStack_1060;
  undefined8 local_1058;
  undefined8 uStack_1050;
  undefined8 local_1048;
  undefined8 uStack_1040;
  ulong local_1038;
  ulong uStack_1030;
  undefined8 local_1028;
  undefined8 uStack_1020;
  ulong local_1018;
  ulong uStack_1010;
  undefined8 local_1008;
  undefined8 uStack_1000;
  ulong local_ff8;
  ulong uStack_ff0;
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  undefined8 local_fd8;
  undefined8 uStack_fd0;
  undefined8 local_fc8;
  undefined8 uStack_fc0;
  ulong local_fb8;
  ulong uStack_fb0;
  undefined8 local_fa8;
  undefined8 uStack_fa0;
  ulong local_f98;
  ulong uStack_f90;
  undefined8 local_f88;
  undefined8 uStack_f80;
  ulong local_f78;
  ulong uStack_f70;
  undefined8 local_f68;
  undefined8 uStack_f60;
  undefined8 local_f58;
  undefined8 uStack_f50;
  undefined8 local_f48;
  undefined8 uStack_f40;
  undefined8 local_f38;
  undefined8 uStack_f30;
  undefined8 local_f28;
  undefined8 uStack_f20;
  undefined8 local_f18;
  undefined8 uStack_f10;
  undefined8 local_f08;
  undefined8 uStack_f00;
  undefined8 local_ef8;
  undefined8 uStack_ef0;
  undefined8 local_ee8;
  undefined8 uStack_ee0;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  undefined8 local_ea8;
  undefined8 uStack_ea0;
  undefined8 local_e98;
  undefined8 uStack_e90;
  short local_e88;
  short sStack_e86;
  short sStack_e84;
  short sStack_e82;
  short sStack_e80;
  short sStack_e7e;
  short sStack_e7c;
  short sStack_e7a;
  undefined8 local_e78;
  undefined8 uStack_e70;
  short local_e68;
  short sStack_e66;
  short sStack_e64;
  short sStack_e62;
  short sStack_e60;
  short sStack_e5e;
  short sStack_e5c;
  short sStack_e5a;
  undefined8 local_e58;
  undefined8 uStack_e50;
  longlong local_e48;
  longlong lStack_e40;
  undefined8 local_e38;
  undefined8 uStack_e30;
  ulong local_e28;
  ulong uStack_e20;
  undefined8 local_e18;
  undefined8 uStack_e10;
  ulong local_e08;
  ulong uStack_e00;
  undefined1 (*local_df0) [16];
  long local_de8;
  undefined1 (*local_de0) [16];
  undefined1 (*local_dd8) [16];
  undefined1 (*local_dd0) [16];
  long local_dc8;
  undefined1 (*local_dc0) [16];
  undefined1 (*local_db8) [16];
  undefined8 *local_db0;
  undefined8 *local_da8;
  undefined1 (*local_da0) [16];
  undefined8 local_d98;
  undefined8 uStack_d90;
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined8 local_d78;
  undefined8 uStack_d70;
  undefined8 local_d68;
  undefined8 uStack_d60;
  undefined8 local_d58;
  undefined8 uStack_d50;
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined8 local_c38;
  undefined8 uStack_c30;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined8 local_af8;
  undefined8 uStack_af0;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  ulong local_868;
  longlong lStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  longlong local_848;
  longlong lStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  longlong lStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined1 *local_808;
  undefined8 *local_800;
  undefined1 *local_7f8;
  undefined8 *local_7f0;
  undefined1 *local_7e8;
  undefined8 *local_7e0;
  undefined1 *local_7d8;
  undefined8 *local_7d0;
  undefined1 *local_7c8;
  undefined8 *local_7c0;
  undefined1 *local_7b8;
  undefined8 *local_7b0;
  undefined1 *local_7a8;
  undefined8 *local_7a0;
  undefined1 *local_798;
  undefined8 *local_790;
  undefined1 *local_788;
  undefined8 *local_780;
  undefined1 *local_778;
  undefined8 *local_770;
  undefined1 *local_768;
  undefined8 *local_760;
  undefined1 *local_758;
  undefined8 *local_750;
  undefined1 *local_748;
  undefined8 *local_740;
  undefined1 *local_738;
  undefined8 *local_730;
  undefined1 *local_728;
  undefined8 *local_720;
  undefined1 *local_718;
  undefined8 *local_710;
  undefined1 *local_708;
  undefined8 *local_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  longlong *local_390;
  longlong *local_388;
  longlong *local_380;
  longlong *local_378;
  longlong *local_370;
  longlong *local_368;
  longlong *local_360;
  longlong *local_358;
  longlong *local_350;
  longlong *local_348;
  size_t *local_340;
  longlong *local_338;
  longlong *local_330;
  longlong *local_328;
  longlong *local_320;
  ulong *local_318;
  size_t *local_310;
  undefined8 local_308;
  undefined8 uStack_300;
  longlong *local_2f8;
  longlong *local_2f0;
  longlong *local_2e8;
  size_t *local_2e0;
  longlong *local_2d8;
  size_t *local_2d0;
  longlong *local_2c8;
  longlong *local_2c0;
  longlong *local_2b8;
  longlong *local_2b0;
  longlong *local_2a8;
  longlong *local_2a0;
  undefined1 *local_298;
  longlong *local_290;
  undefined1 *local_288;
  longlong *local_280;
  longlong *local_278;
  longlong *local_270;
  size_t *local_268;
  longlong *local_260;
  longlong *local_258;
  size_t *local_250;
  size_t local_248;
  longlong lStack_240;
  size_t local_238;
  longlong lStack_230;
  longlong local_228;
  undefined4 uStack_21c;
  undefined4 local_218;
  int iStack_214;
  int iStack_210;
  int iStack_20c;
  longlong local_208;
  longlong lStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  ulong local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  longlong lStack_1b0;
  long local_1a8;
  ulong uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined4 local_13c;
  ulong local_138;
  undefined8 uStack_130;
  undefined4 local_11c;
  int local_118;
  int iStack_114;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  longlong local_a8;
  longlong lStack_a0;
  longlong local_98;
  longlong lStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  puVar57 = Image::data<unsigned_char>(*(Image **)(this + 8));
  lVar52 = m1[1];
  lVar51 = m1[0];
  lVar6 = s0_3[1];
  iVar58 = Image::stride(*(Image **)(this + 8));
  m1[1] = lVar52;
  m1[0] = lVar51;
  s0_3[1] = lVar6;
  lVar52 = m1[1];
  lVar51 = m1[0];
  lVar6 = s0_3[1];
  y1 = (size_t)*(int *)(this + 0x40);
  iVar1 = *(int *)(this + 0x44);
  cellLine = (Cell *)(*(long *)(this + 0x50) + y1 * *(long *)(this + 0x48) * 8);
  compositor._u32[1] = *(long *)(this + 0x60) + y1 * *(long *)(this + 0x58) * 8;
  uVar55 = PixelUtils::premultiply(argb32);
  m1[1] = lVar52;
  m1[0] = lVar51;
  s0_3[1] = lVar6;
  lVar52 = m1[1];
  lVar51 = m1[0];
  lVar6 = s0_3[1];
  auVar73._8_4_ = uVar55;
  auVar73._0_8_ = CONCAT44(uVar55,uVar55);
  auVar73._12_4_ = uVar55;
  auVar73 = pmovzxbw(auVar73,CONCAT44(uVar55,uVar55));
  local_2558 = auVar73._0_8_;
  uStack_2550 = auVar73._8_8_;
  dstStride = (intptr_t)(puVar57 + y1 * iVar58);
  do {
    m1[1] = lVar52;
    m1[0] = lVar51;
    s0_3[1] = lVar6;
    uVar54 = m1[1]._4_4_;
    uVar16 = m1[0]._4_4_;
    uVar13 = s0_3[1]._4_4_;
    if ((ulong)(long)iVar1 < y1) {
      lVar6 = s0_3[1];
      s0_3[1]._4_4_ = uVar13;
      lVar51 = m1[0];
      m1[0]._4_4_ = uVar16;
      lVar52 = m1[1];
      m1[1]._4_4_ = uVar54;
      Bounds::reset((Bounds *)(this + 0x40));
      return;
    }
    cell = *(Cell **)(this + 0x48);
    x0._4_4_ = 0;
    xOffset = 0;
    it._xorMask = 0;
    uVar7 = local_1148;
    uVar12 = uStack_1140;
    do {
      m1[1]._4_4_ = uVar54;
      m1[0]._4_4_ = uVar16;
      s0_3[1]._4_4_ = uVar13;
      uStack_1140 = uVar12;
      local_1148 = uVar7;
      uVar54 = m1[1]._4_4_;
      uVar16 = m1[0]._4_4_;
      uVar13 = s0_3[1]._4_4_;
      x1 = *(size_t *)cellLine;
      it._bitWord = 0;
      cellLine->cover = 0;
      cellLine->area = 0;
      while( true ) {
        m1[1]._4_4_ = uVar54;
        m1[0]._4_4_ = uVar16;
        s0_3[1]._4_4_ = uVar13;
        uVar12 = uStack_1140;
        uVar7 = local_1148;
        uVar54 = m1[1]._4_4_;
        uVar16 = m1[0]._4_4_;
        uVar13 = s0_3[1]._4_4_;
        uVar62 = it._xorMask;
        sVar5 = x1;
        local_1148._0_2_ = auVar73._0_2_;
        sVar67 = (short)local_1148;
        local_1148._2_2_ = auVar73._2_2_;
        sVar68 = local_1148._2_2_;
        local_1148._4_2_ = auVar73._4_2_;
        sVar69 = local_1148._4_2_;
        local_1148._6_2_ = auVar73._6_2_;
        sVar70 = local_1148._6_2_;
        uStack_1140._0_2_ = auVar73._8_2_;
        sVar82 = (short)uStack_1140;
        uStack_1140._2_2_ = auVar73._10_2_;
        sVar83 = uStack_1140._2_2_;
        uStack_1140._4_2_ = auVar73._12_2_;
        sVar84 = uStack_1140._4_2_;
        uStack_1140._6_2_ = auVar73._14_2_;
        sVar85 = uStack_1140._6_2_;
        s0_3[1]._4_4_ = uVar13;
        m1[0]._4_4_ = uVar16;
        m1[1]._4_4_ = uVar54;
        if (x1 == 0) break;
        local_1148 = uVar7;
        uStack_1140 = uVar12;
        if (x1 == 0) {
          lVar6 = s0_3[1];
          lVar51 = m1[0];
          lVar52 = m1[1];
          __assert_fail("bitWord != T(0)",
                        "/workspace/llm4binary/github/license_c_cmakelists/kobalicek[P]b2drefras/./intutils.h"
                        ,0x151,
                        "size_t IntUtils::BitWordFlipIterator<unsigned long>::nextAndFlip() [T = unsigned long]"
                       );
        }
        lVar6 = s0_3[1];
        lVar51 = m1[0];
        lVar52 = m1[1];
        uVar56 = IntUtils::ctz<unsigned_long>(x1);
        lVar52 = m1[1];
        lVar51 = m1[0];
        lVar6 = s0_3[1];
        uVar13 = s0_3[1]._4_4_;
        s0_3[1] = lVar6;
        uVar16 = m1[0]._4_4_;
        m1[0] = lVar51;
        uVar54 = m1[1]._4_4_;
        m1[1] = lVar52;
        lVar6 = s0_3[1];
        s0_3[1]._4_4_ = uVar13;
        lVar51 = m1[0];
        m1[0]._4_4_ = uVar16;
        lVar52 = m1[1];
        m1[1]._4_4_ = uVar54;
        uVar59 = IntUtils::allOnes<unsigned_long>();
        lVar52 = m1[1];
        lVar51 = m1[0];
        lVar6 = s0_3[1];
        uVar60 = uVar59 << ((byte)uVar56 & 0x3f) ^ sVar5;
        uVar13 = s0_3[1]._4_4_;
        s0_3[1] = lVar6;
        uVar16 = m1[0]._4_4_;
        m1[0] = lVar51;
        uVar54 = m1[1]._4_4_;
        m1[1] = lVar52;
        lVar6 = s0_3[1];
        s0_3[1]._4_4_ = uVar13;
        lVar51 = m1[0];
        m1[0]._4_4_ = uVar16;
        lVar52 = m1[1];
        m1[1]._4_4_ = uVar54;
        uVar61 = IntUtils::allOnes<unsigned_long>();
        lVar52 = m1[1];
        lVar51 = m1[0];
        lVar6 = s0_3[1];
        uVar59 = it._xorMask;
        it._bitWord = uVar61 ^ it._bitWord;
        uStack_2500 = uVar62 + (ulong)uVar56 * 0x10;
        sVar5 = xOffset;
        uVar53 = local_fd8;
        uVar72 = uStack_fd0;
        if (xOffset < uStack_2500) {
          local_23bc = x0._4_4_;
          if ((int)x0._4_4_ < 0) {
            local_23bc = -x0._4_4_;
          }
          if (0xff < (int)local_23bc) {
            local_23bc = 0xff;
          }
          local_2504 = local_23bc;
          sVar5 = uStack_2500;
          if (local_23bc != 0) {
            local_21f0 = xOffset;
            mVal[1] = uStack_2500 - xOffset >> 2;
            if (local_23bc == 0xff) {
              for (; 7 < (ulong)mVal[1]; mVal[1] = mVal[1] + -8) {
                local_1340 = (undefined8 *)(dstStride + local_21f0 * 4);
                local_1358 = CONCAT44(uVar55,uVar55);
                uStack_1350 = CONCAT44(uVar55,uVar55);
                *local_1340 = local_1358;
                local_1340[1] = uStack_1350;
                lVar64 = dstStride + local_21f0 * 4;
                local_1320 = (undefined8 *)(lVar64 + 0x10);
                local_1338 = CONCAT44(uVar55,uVar55);
                uStack_1330 = CONCAT44(uVar55,uVar55);
                *local_1320 = local_1338;
                *(undefined8 *)(lVar64 + 0x18) = uStack_1330;
                lVar64 = dstStride + local_21f0 * 4;
                local_1300 = (undefined8 *)(lVar64 + 0x20);
                local_1318 = CONCAT44(uVar55,uVar55);
                uStack_1310 = CONCAT44(uVar55,uVar55);
                *local_1300 = local_1318;
                *(undefined8 *)(lVar64 + 0x28) = uStack_1310;
                lVar64 = dstStride + local_21f0 * 4;
                local_12e0 = (undefined8 *)(lVar64 + 0x30);
                local_12f8 = CONCAT44(uVar55,uVar55);
                uStack_12f0 = CONCAT44(uVar55,uVar55);
                *local_12e0 = local_12f8;
                *(undefined8 *)(lVar64 + 0x38) = uStack_12f0;
                lVar64 = dstStride + local_21f0 * 4;
                local_12c0 = (undefined8 *)(lVar64 + 0x40);
                local_12d8 = CONCAT44(uVar55,uVar55);
                uStack_12d0 = CONCAT44(uVar55,uVar55);
                *local_12c0 = local_12d8;
                *(undefined8 *)(lVar64 + 0x48) = uStack_12d0;
                lVar64 = dstStride + local_21f0 * 4;
                local_12a0 = (undefined8 *)(lVar64 + 0x50);
                local_12b8 = CONCAT44(uVar55,uVar55);
                uStack_12b0 = CONCAT44(uVar55,uVar55);
                *local_12a0 = local_12b8;
                *(undefined8 *)(lVar64 + 0x58) = uStack_12b0;
                lVar64 = dstStride + local_21f0 * 4;
                local_1280 = (undefined8 *)(lVar64 + 0x60);
                local_1298 = CONCAT44(uVar55,uVar55);
                uStack_1290 = CONCAT44(uVar55,uVar55);
                *local_1280 = local_1298;
                *(undefined8 *)(lVar64 + 0x68) = uStack_1290;
                lVar64 = dstStride + local_21f0 * 4;
                local_1260 = (undefined8 *)(lVar64 + 0x70);
                local_1278 = CONCAT44(uVar55,uVar55);
                uStack_1270 = CONCAT44(uVar55,uVar55);
                *local_1260 = local_1278;
                *(undefined8 *)(lVar64 + 0x78) = uStack_1270;
                local_21f0 = local_21f0 + 0x20;
              }
              for (; mVal[1] != 0; mVal[1] = mVal[1] + -1) {
                local_1360 = (undefined8 *)(dstStride + local_21f0 * 4);
                local_1378 = CONCAT44(uVar55,uVar55);
                uStack_1370 = CONCAT44(uVar55,uVar55);
                *local_1360 = local_1378;
                local_1360[1] = uStack_1370;
                local_21f0 = local_21f0 + 4;
              }
              for (; sVar5 = uStack_2500, local_21f0 < uStack_2500; local_21f0 = local_21f0 + 1) {
                local_1198 = CONCAT44(uVar55,uVar55);
                uStack_1190 = CONCAT44(uVar55,uVar55);
                *(uint32_t *)(dstStride + local_21f0 * 4) = uVar55;
                local_1188 = local_1198;
                uStack_1180 = uStack_1190;
              }
            }
            else {
              auVar127 = pshuflw(ZEXT416(local_23bc),ZEXT416(local_23bc),0);
              local_2228 = auVar127._0_4_;
              sStack_2218 = auVar127._0_2_;
              sStack_2216 = auVar127._2_2_;
              local_1048 = local_2558;
              uStack_1040 = uStack_2550;
              local_1058 = CONCAT26(sStack_2216,CONCAT24(sStack_2218,local_2228));
              uStack_1050 = CONCAT26(sStack_2216,CONCAT24(sStack_2218,local_2228));
              sVar66 = sVar67 * sStack_2218;
              sVar80 = sVar68 * sStack_2216;
              sVar81 = sVar69 * sStack_2218;
              sVar91 = sVar70 * sStack_2216;
              sVar92 = sVar82 * sStack_2218;
              sVar99 = sVar83 * sStack_2216;
              sVar100 = sVar84 * sStack_2218;
              sVar105 = sVar85 * sStack_2216;
              uVar7 = CONCAT26(sVar91,CONCAT24(sVar81,CONCAT22(sVar80,sVar66)));
              uVar12 = CONCAT26(sVar105,CONCAT24(sVar100,CONCAT22(sVar99,sVar92)));
              local_e68 = sStack_2218;
              sStack_e66 = sStack_2216;
              sStack_e64 = sStack_2218;
              sStack_e62 = sStack_2216;
              sStack_e60 = sStack_2218;
              sStack_e5e = sStack_2216;
              sStack_e5c = sStack_2218;
              sStack_e5a = sStack_2216;
              local_e78 = 0xff00ff00ff00ff;
              uStack_e70 = 0xff00ff00ff00ff;
              uVar71 = CONCAT26(sStack_2216,CONCAT24(sStack_2218,local_2228)) ^ 0xff00ff00ff00ff;
              uVar107 = CONCAT26(sStack_2216,CONCAT24(sStack_2218,local_2228)) ^ 0xff00ff00ff00ff;
              while( true ) {
                uVar72 = uStack_fd0;
                uVar53 = local_fd8;
                local_fd8._0_2_ = (short)uVar71;
                local_fd8._2_2_ = (short)(uVar71 >> 0x10);
                local_fd8._4_2_ = (short)(uVar71 >> 0x20);
                local_fd8._6_2_ = (short)(uVar71 >> 0x30);
                uStack_fd0._0_2_ = (short)uVar107;
                uStack_fd0._2_2_ = (short)(uVar107 >> 0x10);
                uStack_fd0._4_2_ = (short)(uVar107 >> 0x20);
                uStack_fd0._6_2_ = (short)(uVar107 >> 0x30);
                if ((ulong)mVal[1] < 2) break;
                local_dc0 = (undefined1 (*) [16])(dstStride + local_21f0 * 4);
                local_d08 = *(undefined8 *)*local_dc0;
                uVar3 = *(undefined8 *)(*local_dc0 + 8);
                lVar64 = dstStride + local_21f0 * 4;
                local_db8 = (undefined1 (*) [16])(lVar64 + 0x10);
                local_ce8 = *(undefined8 *)*local_db8;
                uVar4 = *(undefined8 *)(lVar64 + 0x18);
                local_c78 = 0;
                uStack_c70 = 0;
                local_d18 = 0;
                uStack_d10 = 0;
                uStack_d00._0_1_ = (byte)uVar3;
                uStack_d00._1_1_ = (byte)((ulong)uVar3 >> 8);
                uStack_d00._2_1_ = (byte)((ulong)uVar3 >> 0x10);
                uStack_d00._3_1_ = (byte)((ulong)uVar3 >> 0x18);
                uStack_d00._4_1_ = (byte)((ulong)uVar3 >> 0x20);
                uStack_d00._5_1_ = (byte)((ulong)uVar3 >> 0x28);
                uStack_d00._6_1_ = (byte)((ulong)uVar3 >> 0x30);
                uStack_d00._7_1_ = (byte)((ulong)uVar3 >> 0x38);
                local_c68 = 0;
                uStack_c60 = 0;
                local_cf8 = 0;
                uStack_cf0 = 0;
                uStack_ce0._0_1_ = (byte)uVar4;
                uStack_ce0._1_1_ = (byte)((ulong)uVar4 >> 8);
                uStack_ce0._2_1_ = (byte)((ulong)uVar4 >> 0x10);
                uStack_ce0._3_1_ = (byte)((ulong)uVar4 >> 0x18);
                uStack_ce0._4_1_ = (byte)((ulong)uVar4 >> 0x20);
                uStack_ce0._5_1_ = (byte)((ulong)uVar4 >> 0x28);
                uStack_ce0._6_1_ = (byte)((ulong)uVar4 >> 0x30);
                uStack_ce0._7_1_ = (byte)((ulong)uVar4 >> 0x38);
                auVar127 = pmovzxbw(*local_dc0,local_d08);
                local_2638 = auVar127._0_8_;
                uStack_2630 = auVar127._8_8_;
                auVar76 = pmovzxbw(*local_db8,local_ce8);
                local_2648 = auVar76._0_8_;
                uStack_2640 = auVar76._8_8_;
                local_fc8._2_2_ = (ushort)uStack_d00._1_1_;
                local_fc8._4_2_ = (ushort)uStack_d00._2_1_;
                local_fc8._6_2_ = (ushort)uStack_d00._3_1_;
                uStack_fc0._2_2_ = (ushort)uStack_d00._5_1_;
                uStack_fc0._4_2_ = (ushort)uStack_d00._6_1_;
                uStack_fc0._6_2_ = (ushort)uStack_d00._7_1_;
                sVar112 = (ushort)(byte)uStack_d00 * (short)local_fd8;
                sVar101 = (ushort)uStack_d00._4_1_ * (short)uStack_fd0;
                local_8d8 = CONCAT26(local_fc8._6_2_ * local_fd8._6_2_,
                                     CONCAT24(local_fc8._4_2_ * local_fd8._4_2_,
                                              CONCAT22(local_fc8._2_2_ * local_fd8._2_2_,sVar112)));
                uStack_8d0 = CONCAT26(uStack_fc0._6_2_ * uStack_fd0._6_2_,
                                      CONCAT24(uStack_fc0._4_2_ * uStack_fd0._4_2_,
                                               CONCAT22(uStack_fc0._2_2_ * uStack_fd0._2_2_,sVar101)
                                              ));
                local_fa8._2_2_ = (ushort)uStack_ce0._1_1_;
                local_fa8._4_2_ = (ushort)uStack_ce0._2_1_;
                local_fa8._6_2_ = (ushort)uStack_ce0._3_1_;
                uStack_fa0._2_2_ = (ushort)uStack_ce0._5_1_;
                uStack_fa0._4_2_ = (ushort)uStack_ce0._6_1_;
                uStack_fa0._6_2_ = (ushort)uStack_ce0._7_1_;
                sVar113 = (ushort)(byte)uStack_ce0 * (short)local_fd8;
                sVar102 = (ushort)uStack_ce0._4_1_ * (short)uStack_fd0;
                local_8b8 = CONCAT26(local_fa8._6_2_ * local_fd8._6_2_,
                                     CONCAT24(local_fa8._4_2_ * local_fd8._4_2_,
                                              CONCAT22(local_fa8._2_2_ * local_fd8._2_2_,sVar113)));
                uStack_8b0 = CONCAT26(uStack_fa0._6_2_ * uStack_fd0._6_2_,
                                      CONCAT24(uStack_fa0._4_2_ * uStack_fd0._4_2_,
                                               CONCAT22(uStack_fa0._2_2_ * uStack_fd0._2_2_,sVar102)
                                              ));
                local_f88._0_2_ = auVar127._0_2_;
                local_f88._2_2_ = auVar127._2_2_;
                local_f88._4_2_ = auVar127._4_2_;
                local_f88._6_2_ = auVar127._6_2_;
                uStack_f80._0_2_ = auVar127._8_2_;
                uStack_f80._2_2_ = auVar127._10_2_;
                uStack_f80._4_2_ = auVar127._12_2_;
                uStack_f80._6_2_ = auVar127._14_2_;
                local_898 = CONCAT26(local_f88._6_2_ * local_fd8._6_2_,
                                     CONCAT24(local_f88._4_2_ * local_fd8._4_2_,
                                              CONCAT22(local_f88._2_2_ * local_fd8._2_2_,
                                                       (short)local_f88 * (short)local_fd8)));
                uStack_890 = CONCAT26(uStack_f80._6_2_ * uStack_fd0._6_2_,
                                      CONCAT24(uStack_f80._4_2_ * uStack_fd0._4_2_,
                                               CONCAT22(uStack_f80._2_2_ * uStack_fd0._2_2_,
                                                        (short)uStack_f80 * (short)uStack_fd0)));
                local_f68._0_2_ = auVar76._0_2_;
                local_f68._2_2_ = auVar76._2_2_;
                local_f68._4_2_ = auVar76._4_2_;
                local_f68._6_2_ = auVar76._6_2_;
                uStack_f60._0_2_ = auVar76._8_2_;
                uStack_f60._2_2_ = auVar76._10_2_;
                uStack_f60._4_2_ = auVar76._12_2_;
                uStack_f60._6_2_ = auVar76._14_2_;
                local_878 = CONCAT26(local_f68._6_2_ * local_fd8._6_2_,
                                     CONCAT24(local_f68._4_2_ * local_fd8._4_2_,
                                              CONCAT22(local_f68._2_2_ * local_fd8._2_2_,
                                                       (short)local_f68 * (short)local_fd8)));
                uStack_870 = CONCAT26(uStack_f60._6_2_ * uStack_fd0._6_2_,
                                      CONCAT24(uStack_f60._4_2_ * uStack_fd0._4_2_,
                                               CONCAT22(uStack_f60._2_2_ * uStack_fd0._2_2_,
                                                        (short)uStack_f60 * (short)uStack_fd0)));
                sVar112 = sVar112 + sVar66;
                sVar125 = local_fc8._2_2_ * local_fd8._2_2_ + sVar80;
                sVar86 = local_fc8._4_2_ * local_fd8._4_2_ + sVar81;
                sVar94 = local_fc8._6_2_ * local_fd8._6_2_ + sVar91;
                sVar101 = sVar101 + sVar92;
                sVar108 = uStack_fc0._2_2_ * uStack_fd0._2_2_ + sVar99;
                sVar114 = uStack_fc0._4_2_ * uStack_fd0._4_2_ + sVar100;
                sVar121 = uStack_fc0._6_2_ * uStack_fd0._6_2_ + sVar105;
                local_af8 = CONCAT26(sVar94,CONCAT24(sVar86,CONCAT22(sVar125,sVar112)));
                uStack_af0 = CONCAT26(sVar121,CONCAT24(sVar114,CONCAT22(sVar108,sVar101)));
                sVar113 = sVar113 + sVar66;
                sVar126 = local_fa8._2_2_ * local_fd8._2_2_ + sVar80;
                sVar87 = local_fa8._4_2_ * local_fd8._4_2_ + sVar81;
                sVar95 = local_fa8._6_2_ * local_fd8._6_2_ + sVar91;
                sVar102 = sVar102 + sVar92;
                sVar109 = uStack_fa0._2_2_ * uStack_fd0._2_2_ + sVar99;
                sVar115 = uStack_fa0._4_2_ * uStack_fd0._4_2_ + sVar100;
                sVar122 = uStack_fa0._6_2_ * uStack_fd0._6_2_ + sVar105;
                local_ad8 = CONCAT26(sVar95,CONCAT24(sVar87,CONCAT22(sVar126,sVar113)));
                uStack_ad0 = CONCAT26(sVar122,CONCAT24(sVar115,CONCAT22(sVar109,sVar102)));
                sVar118 = (short)local_f88 * (short)local_fd8 + sVar66;
                sVar77 = local_f88._2_2_ * local_fd8._2_2_ + sVar80;
                sVar88 = local_f88._4_2_ * local_fd8._4_2_ + sVar81;
                sVar96 = local_f88._6_2_ * local_fd8._6_2_ + sVar91;
                sVar103 = (short)uStack_f80 * (short)uStack_fd0 + sVar92;
                sVar110 = uStack_f80._2_2_ * uStack_fd0._2_2_ + sVar99;
                sVar116 = uStack_f80._4_2_ * uStack_fd0._4_2_ + sVar100;
                sVar123 = uStack_f80._6_2_ * uStack_fd0._6_2_ + sVar105;
                local_ab8 = CONCAT26(sVar96,CONCAT24(sVar88,CONCAT22(sVar77,sVar118)));
                uStack_ab0 = CONCAT26(sVar123,CONCAT24(sVar116,CONCAT22(sVar110,sVar103)));
                sVar119 = (short)local_f68 * (short)local_fd8 + sVar66;
                sVar78 = local_f68._2_2_ * local_fd8._2_2_ + sVar80;
                sVar89 = local_f68._4_2_ * local_fd8._4_2_ + sVar81;
                sVar97 = local_f68._6_2_ * local_fd8._6_2_ + sVar91;
                sVar104 = (short)uStack_f60 * (short)uStack_fd0 + sVar92;
                sVar111 = uStack_f60._2_2_ * uStack_fd0._2_2_ + sVar99;
                sVar117 = uStack_f60._4_2_ * uStack_fd0._4_2_ + sVar100;
                sVar124 = uStack_f60._6_2_ * uStack_fd0._6_2_ + sVar105;
                local_a98 = CONCAT26(sVar97,CONCAT24(sVar89,CONCAT22(sVar78,sVar119)));
                uStack_a90 = CONCAT26(sVar124,CONCAT24(sVar117,CONCAT22(sVar111,sVar104)));
                local_1890 = s2 + 1;
                local_1888 = SIMD::(anonymous_namespace)::u16_0080_128;
                local_b08 = 0x80008000800080;
                uStack_b00 = 0x80008000800080;
                local_18a8 = CONCAT26(sVar94 + 0x80,
                                      CONCAT24(sVar86 + 0x80,CONCAT22(sVar125 + 0x80,sVar112 + 0x80)
                                              ));
                uStack_18a0 = CONCAT26(sVar121 + 0x80,
                                       CONCAT24(sVar114 + 0x80,
                                                CONCAT22(sVar108 + 0x80,sVar101 + 0x80)));
                local_760 = &local_18a8;
                local_768 = SIMD::(anonymous_namespace)::u16_0101_128;
                auVar42._8_8_ = uStack_18a0;
                auVar42._0_8_ = local_18a8;
                local_638 = 0x101010101010101;
                uStack_630 = 0x101010101010101;
                auVar23._8_8_ = 0x101010101010101;
                auVar23._0_8_ = 0x101010101010101;
                auVar127 = pmulhuw(auVar42,auVar23);
                local_26e8 = auVar127._0_8_;
                s2[1] = local_26e8;
                lStack_26e0 = auVar127._8_8_;
                s1[0] = lStack_26e0;
                local_18c0 = s0_1 + 1;
                local_18b8 = SIMD::(anonymous_namespace)::u16_0080_128;
                local_ae8 = 0x80008000800080;
                uStack_ae0 = 0x80008000800080;
                local_18d8 = CONCAT26(sVar95 + 0x80,
                                      CONCAT24(sVar87 + 0x80,CONCAT22(sVar126 + 0x80,sVar113 + 0x80)
                                              ));
                uStack_18d0 = CONCAT26(sVar122 + 0x80,
                                       CONCAT24(sVar115 + 0x80,
                                                CONCAT22(sVar109 + 0x80,sVar102 + 0x80)));
                local_750 = &local_18d8;
                local_758 = SIMD::(anonymous_namespace)::u16_0101_128;
                auVar41._8_8_ = uStack_18d0;
                auVar41._0_8_ = local_18d8;
                local_658 = 0x101010101010101;
                uStack_650 = 0x101010101010101;
                auVar22._8_8_ = 0x101010101010101;
                auVar22._0_8_ = 0x101010101010101;
                auVar76 = pmulhuw(auVar41,auVar22);
                local_2708 = auVar76._0_8_;
                s0_1[1] = local_2708;
                lStack_2700 = auVar76._8_8_;
                s3[0] = lStack_2700;
                local_18f0 = s1 + 1;
                local_18e8 = SIMD::(anonymous_namespace)::u16_0080_128;
                local_ac8 = 0x80008000800080;
                uStack_ac0 = 0x80008000800080;
                local_1908 = CONCAT26(sVar96 + 0x80,
                                      CONCAT24(sVar88 + 0x80,CONCAT22(sVar77 + 0x80,sVar118 + 0x80))
                                     );
                uStack_1900 = CONCAT26(sVar123 + 0x80,
                                       CONCAT24(sVar116 + 0x80,
                                                CONCAT22(sVar110 + 0x80,sVar103 + 0x80)));
                local_740 = &local_1908;
                local_748 = SIMD::(anonymous_namespace)::u16_0101_128;
                auVar40._8_8_ = uStack_1900;
                auVar40._0_8_ = local_1908;
                local_678 = 0x101010101010101;
                uStack_670 = 0x101010101010101;
                auVar21._8_8_ = 0x101010101010101;
                auVar21._0_8_ = 0x101010101010101;
                auVar74 = pmulhuw(auVar40,auVar21);
                local_2728 = auVar74._0_8_;
                uStack_2720 = auVar74._8_8_;
                local_1920 = s3 + 1;
                local_1918 = SIMD::(anonymous_namespace)::u16_0080_128;
                local_aa8 = 0x80008000800080;
                uStack_aa0 = 0x80008000800080;
                local_1938 = CONCAT26(sVar97 + 0x80,
                                      CONCAT24(sVar89 + 0x80,CONCAT22(sVar78 + 0x80,sVar119 + 0x80))
                                     );
                uStack_1930 = CONCAT26(sVar124 + 0x80,
                                       CONCAT24(sVar117 + 0x80,
                                                CONCAT22(sVar111 + 0x80,sVar104 + 0x80)));
                local_730 = &local_1938;
                local_738 = SIMD::(anonymous_namespace)::u16_0101_128;
                auVar39._8_8_ = uStack_1930;
                auVar39._0_8_ = local_1938;
                local_698 = 0x101010101010101;
                uStack_690 = 0x101010101010101;
                auVar20._8_8_ = 0x101010101010101;
                auVar20._0_8_ = 0x101010101010101;
                auVar75 = pmulhuw(auVar39,auVar20);
                local_2748 = auVar75._0_8_;
                uStack_2740 = auVar75._8_8_;
                local_1668 = s1 + 1;
                local_1670 = s2 + 1;
                local_408._0_2_ = auVar74._0_2_;
                local_408._2_2_ = auVar74._2_2_;
                local_408._4_2_ = auVar74._4_2_;
                local_408._6_2_ = auVar74._6_2_;
                uStack_400._0_2_ = auVar74._8_2_;
                uStack_400._2_2_ = auVar74._10_2_;
                uStack_400._4_2_ = auVar74._12_2_;
                uStack_400._6_2_ = auVar74._14_2_;
                local_418._0_2_ = auVar127._0_2_;
                local_418._2_2_ = auVar127._2_2_;
                local_418._4_2_ = auVar127._4_2_;
                local_418._6_2_ = auVar127._6_2_;
                uStack_410._0_2_ = auVar127._8_2_;
                uStack_410._2_2_ = auVar127._10_2_;
                uStack_410._4_2_ = auVar127._12_2_;
                uStack_410._6_2_ = auVar127._14_2_;
                s1[1] = CONCAT17((0 < uStack_400._6_2_) * (uStack_400._6_2_ < 0x100) * auVar74[0xe]
                                 - (0xff < uStack_400._6_2_),
                                 CONCAT16((0 < uStack_400._4_2_) * (uStack_400._4_2_ < 0x100) *
                                          auVar74[0xc] - (0xff < uStack_400._4_2_),
                                          CONCAT15((0 < uStack_400._2_2_) *
                                                   (uStack_400._2_2_ < 0x100) * auVar74[10] -
                                                   (0xff < uStack_400._2_2_),
                                                   CONCAT14((0 < (short)uStack_400) *
                                                            ((short)uStack_400 < 0x100) * auVar74[8]
                                                            - (0xff < (short)uStack_400),
                                                            CONCAT13((0 < local_408._6_2_) *
                                                                     (local_408._6_2_ < 0x100) *
                                                                     auVar74[6] -
                                                                     (0xff < local_408._6_2_),
                                                                     CONCAT12((0 < local_408._4_2_)
                                                                              * (local_408._4_2_ <
                                                                                0x100) * auVar74[4]
                                                                              - (0xff < local_408.
                                                                                        _4_2_),
                                                                              CONCAT11((0 < 
                                                  local_408._2_2_) * (local_408._2_2_ < 0x100) *
                                                  auVar74[2] - (0xff < local_408._2_2_),
                                                  (0 < (short)local_408) *
                                                  ((short)local_408 < 0x100) * auVar74[0] -
                                                  (0xff < (short)local_408))))))));
                lStack_13b0 = CONCAT17((0 < uStack_410._6_2_) * (uStack_410._6_2_ < 0x100) *
                                       auVar127[0xe] - (0xff < uStack_410._6_2_),
                                       CONCAT16((0 < uStack_410._4_2_) * (uStack_410._4_2_ < 0x100)
                                                * auVar127[0xc] - (0xff < uStack_410._4_2_),
                                                CONCAT15((0 < uStack_410._2_2_) *
                                                         (uStack_410._2_2_ < 0x100) * auVar127[10] -
                                                         (0xff < uStack_410._2_2_),
                                                         CONCAT14((0 < (short)uStack_410) *
                                                                  ((short)uStack_410 < 0x100) *
                                                                  auVar127[8] -
                                                                  (0xff < (short)uStack_410),
                                                                  CONCAT13((0 < local_418._6_2_) *
                                                                           (local_418._6_2_ < 0x100)
                                                                           * auVar127[6] -
                                                                           (0xff < local_418._6_2_),
                                                                           CONCAT12((0 < local_418.
                                                                                         _4_2_) *
                                                                                    (local_418._4_2_
                                                                                    < 0x100) *
                                                                                    auVar127[4] -
                                                                                    (0xff < 
                                                  local_418._4_2_),
                                                  CONCAT11((0 < local_418._2_2_) *
                                                           (local_418._2_2_ < 0x100) * auVar127[2] -
                                                           (0xff < local_418._2_2_),
                                                           (0 < (short)local_418) *
                                                           ((short)local_418 < 0x100) * auVar127[0]
                                                           - (0xff < (short)local_418))))))));
                local_1678 = s3 + 1;
                local_1680 = s0_1 + 1;
                local_3e8._0_2_ = auVar75._0_2_;
                local_3e8._2_2_ = auVar75._2_2_;
                local_3e8._4_2_ = auVar75._4_2_;
                local_3e8._6_2_ = auVar75._6_2_;
                uStack_3e0._0_2_ = auVar75._8_2_;
                uStack_3e0._2_2_ = auVar75._10_2_;
                uStack_3e0._4_2_ = auVar75._12_2_;
                uStack_3e0._6_2_ = auVar75._14_2_;
                local_3f8._0_2_ = auVar76._0_2_;
                local_3f8._2_2_ = auVar76._2_2_;
                local_3f8._4_2_ = auVar76._4_2_;
                local_3f8._6_2_ = auVar76._6_2_;
                uStack_3f0._0_2_ = auVar76._8_2_;
                uStack_3f0._2_2_ = auVar76._10_2_;
                uStack_3f0._4_2_ = auVar76._12_2_;
                uStack_3f0._6_2_ = auVar76._14_2_;
                s3[1] = CONCAT17((0 < uStack_3e0._6_2_) * (uStack_3e0._6_2_ < 0x100) * auVar75[0xe]
                                 - (0xff < uStack_3e0._6_2_),
                                 CONCAT16((0 < uStack_3e0._4_2_) * (uStack_3e0._4_2_ < 0x100) *
                                          auVar75[0xc] - (0xff < uStack_3e0._4_2_),
                                          CONCAT15((0 < uStack_3e0._2_2_) *
                                                   (uStack_3e0._2_2_ < 0x100) * auVar75[10] -
                                                   (0xff < uStack_3e0._2_2_),
                                                   CONCAT14((0 < (short)uStack_3e0) *
                                                            ((short)uStack_3e0 < 0x100) * auVar75[8]
                                                            - (0xff < (short)uStack_3e0),
                                                            CONCAT13((0 < local_3e8._6_2_) *
                                                                     (local_3e8._6_2_ < 0x100) *
                                                                     auVar75[6] -
                                                                     (0xff < local_3e8._6_2_),
                                                                     CONCAT12((0 < local_3e8._4_2_)
                                                                              * (local_3e8._4_2_ <
                                                                                0x100) * auVar75[4]
                                                                              - (0xff < local_3e8.
                                                                                        _4_2_),
                                                                              CONCAT11((0 < 
                                                  local_3e8._2_2_) * (local_3e8._2_2_ < 0x100) *
                                                  auVar75[2] - (0xff < local_3e8._2_2_),
                                                  (0 < (short)local_3e8) *
                                                  ((short)local_3e8 < 0x100) * auVar75[0] -
                                                  (0xff < (short)local_3e8))))))));
                s2[0] = CONCAT17((0 < uStack_3f0._6_2_) * (uStack_3f0._6_2_ < 0x100) * auVar76[0xe]
                                 - (0xff < uStack_3f0._6_2_),
                                 CONCAT16((0 < uStack_3f0._4_2_) * (uStack_3f0._4_2_ < 0x100) *
                                          auVar76[0xc] - (0xff < uStack_3f0._4_2_),
                                          CONCAT15((0 < uStack_3f0._2_2_) *
                                                   (uStack_3f0._2_2_ < 0x100) * auVar76[10] -
                                                   (0xff < uStack_3f0._2_2_),
                                                   CONCAT14((0 < (short)uStack_3f0) *
                                                            ((short)uStack_3f0 < 0x100) * auVar76[8]
                                                            - (0xff < (short)uStack_3f0),
                                                            CONCAT13((0 < local_3f8._6_2_) *
                                                                     (local_3f8._6_2_ < 0x100) *
                                                                     auVar76[6] -
                                                                     (0xff < local_3f8._6_2_),
                                                                     CONCAT12((0 < local_3f8._4_2_)
                                                                              * (local_3f8._4_2_ <
                                                                                0x100) * auVar76[4]
                                                                              - (0xff < local_3f8.
                                                                                        _4_2_),
                                                                              CONCAT11((0 < 
                                                  local_3f8._2_2_) * (local_3f8._2_2_ < 0x100) *
                                                  auVar76[2] - (0xff < local_3f8._2_2_),
                                                  (0 < (short)local_3f8) *
                                                  ((short)local_3f8 < 0x100) * auVar76[0] -
                                                  (0xff < (short)local_3f8))))))));
                local_13a0 = (longlong *)(dstStride + local_21f0 * 4);
                *local_13a0 = s1[1];
                local_13a0[1] = lStack_13b0;
                lVar64 = dstStride + local_21f0 * 4;
                local_1380 = (longlong *)(lVar64 + 0x10);
                *local_1380 = s3[1];
                *(longlong *)(lVar64 + 0x18) = s2[0];
                local_21f0 = local_21f0 + 8;
                mVal[1] = mVal[1] + -2;
                local_1910 = local_1920;
                local_18e0 = local_18f0;
                local_18b0 = local_18c0;
                local_1880 = local_1890;
                local_13b8 = s1[1];
                local_1398 = s3[1];
                lStack_1390 = s2[0];
                local_fd8 = uVar71;
                uStack_fd0 = uVar107;
                local_fc8 = (ulong)CONCAT16(uStack_d00._3_1_,
                                            (uint6)CONCAT14(uStack_d00._2_1_,
                                                            (uint)CONCAT12(uStack_d00._1_1_,
                                                                           (ushort)(byte)uStack_d00)
                                                           ));
                uStack_fc0 = (ulong)CONCAT16(uStack_d00._7_1_,
                                             (uint6)CONCAT14(uStack_d00._6_1_,
                                                             (uint)CONCAT12(uStack_d00._5_1_,
                                                                            (ushort)uStack_d00._4_1_
                                                                           )));
                local_fb8 = uVar71;
                uStack_fb0 = uVar107;
                local_fa8 = (ulong)CONCAT16(uStack_ce0._3_1_,
                                            (uint6)CONCAT14(uStack_ce0._2_1_,
                                                            (uint)CONCAT12(uStack_ce0._1_1_,
                                                                           (ushort)(byte)uStack_ce0)
                                                           ));
                uStack_fa0 = (ulong)CONCAT16(uStack_ce0._7_1_,
                                             (uint6)CONCAT14(uStack_ce0._6_1_,
                                                             (uint)CONCAT12(uStack_ce0._5_1_,
                                                                            (ushort)uStack_ce0._4_1_
                                                                           )));
                local_f98 = uVar71;
                uStack_f90 = uVar107;
                local_f88 = local_2638;
                uStack_f80 = uStack_2630;
                local_f78 = uVar71;
                uStack_f70 = uVar107;
                local_f68 = local_2648;
                uStack_f60 = uStack_2640;
                uStack_d00 = uVar3;
                uStack_ce0 = uVar4;
                local_8e8 = uVar7;
                uStack_8e0 = uVar12;
                local_8c8 = uVar7;
                uStack_8c0 = uVar12;
                local_8a8 = uVar7;
                uStack_8a0 = uVar12;
                local_888 = uVar7;
                uStack_880 = uVar12;
                local_688 = local_1938;
                uStack_680 = uStack_1930;
                local_668 = local_1908;
                uStack_660 = uStack_1900;
                local_648 = local_18d8;
                uStack_640 = uStack_18d0;
                local_628 = local_18a8;
                uStack_620 = uStack_18a0;
                local_418 = local_26e8;
                uStack_410 = lStack_26e0;
                local_408 = local_2728;
                uStack_400 = uStack_2720;
                local_3f8 = local_2708;
                uStack_3f0 = lStack_2700;
                local_3e8 = local_2748;
                uStack_3e0 = uStack_2740;
              }
              if (mVal[1] != 0) {
                local_dd0 = (undefined1 (*) [16])(dstStride + local_21f0 * 4);
                local_d28 = *(undefined8 *)*local_dd0;
                uVar3 = *(undefined8 *)(*local_dd0 + 8);
                local_dc8 = dstStride + local_21f0 * 4 + 0x10;
                local_c88 = 0;
                uStack_c80 = 0;
                local_d38 = 0;
                uStack_d30 = 0;
                uStack_d20._0_1_ = (byte)uVar3;
                uStack_d20._1_1_ = (byte)((ulong)uVar3 >> 8);
                uStack_d20._2_1_ = (byte)((ulong)uVar3 >> 0x10);
                uStack_d20._3_1_ = (byte)((ulong)uVar3 >> 0x18);
                uStack_d20._4_1_ = (byte)((ulong)uVar3 >> 0x20);
                uStack_d20._5_1_ = (byte)((ulong)uVar3 >> 0x28);
                uStack_d20._6_1_ = (byte)((ulong)uVar3 >> 0x30);
                uStack_d20._7_1_ = (byte)((ulong)uVar3 >> 0x38);
                uVar14 = CONCAT16(uStack_d20._3_1_,
                                  (uint6)CONCAT14(uStack_d20._2_1_,
                                                  (uint)CONCAT12(uStack_d20._1_1_,
                                                                 (ushort)(byte)uStack_d20)));
                uVar15 = CONCAT16(uStack_d20._7_1_,
                                  (uint6)CONCAT14(uStack_d20._6_1_,
                                                  (uint)CONCAT12(uStack_d20._5_1_,
                                                                 (ushort)uStack_d20._4_1_)));
                auVar127 = pmovzxbw(*local_dd0,local_d28);
                local_27c8 = auVar127._0_8_;
                uStack_27c0 = auVar127._8_8_;
                local_1008._2_2_ = (ushort)uStack_d20._1_1_;
                local_1008._4_2_ = (ushort)uStack_d20._2_1_;
                local_1008._6_2_ = (ushort)uStack_d20._3_1_;
                uStack_1000._2_2_ = (ushort)uStack_d20._5_1_;
                uStack_1000._4_2_ = (ushort)uStack_d20._6_1_;
                uStack_1000._6_2_ = (ushort)uStack_d20._7_1_;
                sVar112 = (ushort)(byte)uStack_d20 * (short)local_fd8;
                sVar86 = (ushort)uStack_d20._4_1_ * (short)uStack_fd0;
                local_918 = CONCAT26(local_1008._6_2_ * local_fd8._6_2_,
                                     CONCAT24(local_1008._4_2_ * local_fd8._4_2_,
                                              CONCAT22(local_1008._2_2_ * local_fd8._2_2_,sVar112)))
                ;
                uStack_910 = CONCAT26(uStack_1000._6_2_ * uStack_fd0._6_2_,
                                      CONCAT24(uStack_1000._4_2_ * uStack_fd0._4_2_,
                                               CONCAT22(uStack_1000._2_2_ * uStack_fd0._2_2_,sVar86)
                                              ));
                local_fe8._0_2_ = auVar127._0_2_;
                local_fe8._2_2_ = auVar127._2_2_;
                local_fe8._4_2_ = auVar127._4_2_;
                local_fe8._6_2_ = auVar127._6_2_;
                uStack_fe0._0_2_ = auVar127._8_2_;
                uStack_fe0._2_2_ = auVar127._10_2_;
                uStack_fe0._4_2_ = auVar127._12_2_;
                uStack_fe0._6_2_ = auVar127._14_2_;
                local_8f8 = CONCAT26(local_fe8._6_2_ * local_fd8._6_2_,
                                     CONCAT24(local_fe8._4_2_ * local_fd8._4_2_,
                                              CONCAT22(local_fe8._2_2_ * local_fd8._2_2_,
                                                       (short)local_fe8 * (short)local_fd8)));
                uStack_8f0 = CONCAT26(uStack_fe0._6_2_ * uStack_fd0._6_2_,
                                      CONCAT24(uStack_fe0._4_2_ * uStack_fd0._4_2_,
                                               CONCAT22(uStack_fe0._2_2_ * uStack_fd0._2_2_,
                                                        (short)uStack_fe0 * (short)uStack_fd0)));
                sVar112 = sVar112 + sVar66;
                sVar118 = local_1008._2_2_ * local_fd8._2_2_ + sVar80;
                sVar125 = local_1008._4_2_ * local_fd8._4_2_ + sVar81;
                sVar77 = local_1008._6_2_ * local_fd8._6_2_ + sVar91;
                sVar86 = sVar86 + sVar92;
                sVar88 = uStack_1000._2_2_ * uStack_fd0._2_2_ + sVar99;
                sVar94 = uStack_1000._4_2_ * uStack_fd0._4_2_ + sVar100;
                sVar96 = uStack_1000._6_2_ * uStack_fd0._6_2_ + sVar105;
                local_b38 = CONCAT26(sVar77,CONCAT24(sVar125,CONCAT22(sVar118,sVar112)));
                uStack_b30 = CONCAT26(sVar96,CONCAT24(sVar94,CONCAT22(sVar88,sVar86)));
                sVar113 = (short)local_fe8 * (short)local_fd8 + sVar66;
                sVar119 = local_fe8._2_2_ * local_fd8._2_2_ + sVar80;
                sVar126 = local_fe8._4_2_ * local_fd8._4_2_ + sVar81;
                sVar78 = local_fe8._6_2_ * local_fd8._6_2_ + sVar91;
                sVar87 = (short)uStack_fe0 * (short)uStack_fd0 + sVar92;
                sVar89 = uStack_fe0._2_2_ * uStack_fd0._2_2_ + sVar99;
                sVar95 = uStack_fe0._4_2_ * uStack_fd0._4_2_ + sVar100;
                sVar97 = uStack_fe0._6_2_ * uStack_fd0._6_2_ + sVar105;
                local_b18 = CONCAT26(sVar78,CONCAT24(sVar126,CONCAT22(sVar119,sVar113)));
                uStack_b10 = CONCAT26(sVar97,CONCAT24(sVar95,CONCAT22(sVar89,sVar87)));
                local_1820 = s0_2 + 1;
                local_1828 = SIMD::(anonymous_namespace)::u16_0080_128;
                local_b48 = 0x80008000800080;
                uStack_b40 = 0x80008000800080;
                local_5e8 = CONCAT26(sVar77 + 0x80,
                                     CONCAT24(sVar125 + 0x80,CONCAT22(sVar118 + 0x80,sVar112 + 0x80)
                                             ));
                uStack_5e0 = CONCAT26(sVar96 + 0x80,
                                      CONCAT24(sVar94 + 0x80,CONCAT22(sVar88 + 0x80,sVar86 + 0x80)))
                ;
                local_780 = &local_1848;
                local_788 = SIMD::(anonymous_namespace)::u16_0101_128;
                auVar75._8_8_ = uStack_5e0;
                auVar75._0_8_ = local_5e8;
                local_5f8 = 0x101010101010101;
                uStack_5f0 = 0x101010101010101;
                auVar76._8_8_ = 0x101010101010101;
                auVar76._0_8_ = 0x101010101010101;
                auVar76 = pmulhuw(auVar75,auVar76);
                local_2828 = auVar76._0_8_;
                lStack_2820 = auVar76._8_8_;
                s0_2[1] = local_2828;
                s1_1[0] = lStack_2820;
                local_1850 = s1_1 + 1;
                local_1858 = SIMD::(anonymous_namespace)::u16_0080_128;
                local_b28 = 0x80008000800080;
                uStack_b20 = 0x80008000800080;
                local_608 = CONCAT26(sVar78 + 0x80,
                                     CONCAT24(sVar126 + 0x80,CONCAT22(sVar119 + 0x80,sVar113 + 0x80)
                                             ));
                uStack_600 = CONCAT26(sVar97 + 0x80,
                                      CONCAT24(sVar95 + 0x80,CONCAT22(sVar89 + 0x80,sVar87 + 0x80)))
                ;
                local_770 = &local_1878;
                local_778 = SIMD::(anonymous_namespace)::u16_0101_128;
                auVar74._8_8_ = uStack_600;
                auVar74._0_8_ = local_608;
                local_618 = 0x101010101010101;
                uStack_610 = 0x101010101010101;
                auVar127._8_8_ = 0x101010101010101;
                auVar127._0_8_ = 0x101010101010101;
                auVar127 = pmulhuw(auVar74,auVar127);
                local_2848 = auVar127._0_8_;
                uStack_2840 = auVar127._8_8_;
                local_1658 = s1_1 + 1;
                local_1660 = s0_2 + 1;
                local_428._0_2_ = auVar127._0_2_;
                local_428._2_2_ = auVar127._2_2_;
                local_428._4_2_ = auVar127._4_2_;
                local_428._6_2_ = auVar127._6_2_;
                uStack_420._0_2_ = auVar127._8_2_;
                uStack_420._2_2_ = auVar127._10_2_;
                uStack_420._4_2_ = auVar127._12_2_;
                uStack_420._6_2_ = auVar127._14_2_;
                local_438._0_2_ = auVar76._0_2_;
                local_438._2_2_ = auVar76._2_2_;
                local_438._4_2_ = auVar76._4_2_;
                local_438._6_2_ = auVar76._6_2_;
                uStack_430._0_2_ = auVar76._8_2_;
                uStack_430._2_2_ = auVar76._10_2_;
                uStack_430._4_2_ = auVar76._12_2_;
                uStack_430._6_2_ = auVar76._14_2_;
                local_13d8 = CONCAT17((0 < uStack_420._6_2_) * (uStack_420._6_2_ < 0x100) *
                                      auVar127[0xe] - (0xff < uStack_420._6_2_),
                                      CONCAT16((0 < uStack_420._4_2_) * (uStack_420._4_2_ < 0x100) *
                                               auVar127[0xc] - (0xff < uStack_420._4_2_),
                                               CONCAT15((0 < uStack_420._2_2_) *
                                                        (uStack_420._2_2_ < 0x100) * auVar127[10] -
                                                        (0xff < uStack_420._2_2_),
                                                        CONCAT14((0 < (short)uStack_420) *
                                                                 ((short)uStack_420 < 0x100) *
                                                                 auVar127[8] -
                                                                 (0xff < (short)uStack_420),
                                                                 CONCAT13((0 < local_428._6_2_) *
                                                                          (local_428._6_2_ < 0x100)
                                                                          * auVar127[6] -
                                                                          (0xff < local_428._6_2_),
                                                                          CONCAT12((0 < local_428.
                                                                                        _4_2_) *
                                                                                   (local_428._4_2_
                                                                                   < 0x100) *
                                                                                   auVar127[4] -
                                                                                   (0xff < local_428
                                                  ._4_2_),CONCAT11((0 < local_428._2_2_) *
                                                                   (local_428._2_2_ < 0x100) *
                                                                   auVar127[2] -
                                                                   (0xff < local_428._2_2_),
                                                                   (0 < (short)local_428) *
                                                                   ((short)local_428 < 0x100) *
                                                                   auVar127[0] -
                                                                   (0xff < (short)local_428))))))));
                lStack_13d0 = CONCAT17((0 < uStack_430._6_2_) * (uStack_430._6_2_ < 0x100) *
                                       auVar76[0xe] - (0xff < uStack_430._6_2_),
                                       CONCAT16((0 < uStack_430._4_2_) * (uStack_430._4_2_ < 0x100)
                                                * auVar76[0xc] - (0xff < uStack_430._4_2_),
                                                CONCAT15((0 < uStack_430._2_2_) *
                                                         (uStack_430._2_2_ < 0x100) * auVar76[10] -
                                                         (0xff < uStack_430._2_2_),
                                                         CONCAT14((0 < (short)uStack_430) *
                                                                  ((short)uStack_430 < 0x100) *
                                                                  auVar76[8] -
                                                                  (0xff < (short)uStack_430),
                                                                  CONCAT13((0 < local_438._6_2_) *
                                                                           (local_438._6_2_ < 0x100)
                                                                           * auVar76[6] -
                                                                           (0xff < local_438._6_2_),
                                                                           CONCAT12((0 < local_438.
                                                                                         _4_2_) *
                                                                                    (local_438._4_2_
                                                                                    < 0x100) *
                                                                                    auVar76[4] -
                                                                                    (0xff < 
                                                  local_438._4_2_),
                                                  CONCAT11((0 < local_438._2_2_) *
                                                           (local_438._2_2_ < 0x100) * auVar76[2] -
                                                           (0xff < local_438._2_2_),
                                                           (0 < (short)local_438) *
                                                           ((short)local_438 < 0x100) * auVar76[0] -
                                                           (0xff < (short)local_438))))))));
                local_13c0 = (longlong *)(dstStride + local_21f0 * 4);
                *local_13c0 = local_13d8;
                local_13c0[1] = lStack_13d0;
                local_21f0 = local_21f0 + 4;
                uStack_420 = uStack_2840;
                local_428 = local_2848;
                uStack_430 = lStack_2820;
                local_438 = local_2828;
                uStack_900 = uVar12;
                local_908 = uVar7;
                uStack_920 = uVar12;
                local_928 = uVar7;
                uStack_d20 = uVar3;
                uStack_fe0 = uStack_27c0;
                local_fe8 = local_27c8;
                uStack_ff0 = uVar107;
                local_ff8 = uVar71;
                uStack_1000 = (ulong)uVar15;
                local_1008 = (ulong)uVar14;
                uStack_1010 = uVar107;
                local_1018 = uVar71;
                local_1830 = local_1820;
                uStack_1840 = uStack_5e0;
                local_1848 = local_5e8;
                local_1860 = local_1850;
                uStack_1870 = uStack_600;
                local_1878 = local_608;
                s0_1[0] = lStack_13d0;
                s1_1[1] = local_13d8;
              }
              for (; sVar5 = uStack_2500, local_21f0 < uStack_2500; local_21f0 = local_21f0 + 1) {
                local_15a0 = (uint *)(dstStride + local_21f0 * 4);
                local_1584 = *local_15a0;
                local_1598._4_4_ = 0;
                local_1598._0_4_ = local_1584;
                auVar33._8_8_ = 0;
                auVar33._0_8_ = local_1598._0_8_;
                auVar127 = pmovzxbw(auVar33,local_1598._0_8_);
                local_2868 = auVar127._0_8_;
                uStack_2860 = auVar127._8_8_;
                local_1028._0_2_ = auVar127._0_2_;
                local_1028._2_2_ = auVar127._2_2_;
                local_1028._4_2_ = auVar127._4_2_;
                local_1028._6_2_ = auVar127._6_2_;
                uStack_1020._0_2_ = auVar127._8_2_;
                uStack_1020._2_2_ = auVar127._10_2_;
                uStack_1020._4_2_ = auVar127._12_2_;
                uStack_1020._6_2_ = auVar127._14_2_;
                local_938 = CONCAT26(local_1028._6_2_ * local_fd8._6_2_,
                                     CONCAT24(local_1028._4_2_ * local_fd8._4_2_,
                                              CONCAT22(local_1028._2_2_ * local_fd8._2_2_,
                                                       (short)local_1028 * (short)local_fd8)));
                uStack_930 = CONCAT26(uStack_1020._6_2_ * uStack_fd0._6_2_,
                                      CONCAT24(uStack_1020._4_2_ * uStack_fd0._4_2_,
                                               CONCAT22(uStack_1020._2_2_ * uStack_fd0._2_2_,
                                                        (short)uStack_1020 * (short)uStack_fd0)));
                sVar112 = (short)local_1028 * (short)local_fd8 + sVar66;
                sVar113 = local_1028._2_2_ * local_fd8._2_2_ + sVar80;
                sVar118 = local_1028._4_2_ * local_fd8._4_2_ + sVar81;
                sVar119 = local_1028._6_2_ * local_fd8._6_2_ + sVar91;
                sVar125 = (short)uStack_1020 * (short)uStack_fd0 + sVar92;
                sVar126 = uStack_1020._2_2_ * uStack_fd0._2_2_ + sVar99;
                sVar77 = uStack_1020._4_2_ * uStack_fd0._4_2_ + sVar100;
                sVar78 = uStack_1020._6_2_ * uStack_fd0._6_2_ + sVar105;
                local_b58 = CONCAT26(sVar119,CONCAT24(sVar118,CONCAT22(sVar113,sVar112)));
                uStack_b50 = CONCAT26(sVar78,CONCAT24(sVar77,CONCAT22(sVar126,sVar125)));
                local_1800 = &uStack_22c8;
                local_17f8 = SIMD::(anonymous_namespace)::u16_0080_128;
                local_b68 = 0x80008000800080;
                uStack_b60 = 0x80008000800080;
                local_1818 = CONCAT26(sVar119 + 0x80,
                                      CONCAT24(sVar118 + 0x80,
                                               CONCAT22(sVar113 + 0x80,sVar112 + 0x80)));
                uStack_1810 = CONCAT26(sVar78 + 0x80,
                                       CONCAT24(sVar77 + 0x80,
                                                CONCAT22(sVar126 + 0x80,sVar125 + 0x80)));
                local_790 = &local_1818;
                local_798 = SIMD::(anonymous_namespace)::u16_0101_128;
                auVar43._8_8_ = uStack_1810;
                auVar43._0_8_ = local_1818;
                local_5d8 = 0x101010101010101;
                uStack_5d0 = 0x101010101010101;
                auVar24._8_8_ = 0x101010101010101;
                auVar24._0_8_ = 0x101010101010101;
                auVar127 = pmulhuw(auVar43,auVar24);
                local_28a8 = auVar127._0_8_;
                uStack_28a0 = auVar127._8_8_;
                local_1648 = &uStack_22c8;
                local_1650 = &uStack_22c8;
                local_458 = local_28a8;
                uStack_450 = uStack_28a0;
                local_448._0_2_ = auVar127._0_2_;
                local_448._2_2_ = auVar127._2_2_;
                local_448._4_2_ = auVar127._4_2_;
                local_448._6_2_ = auVar127._6_2_;
                uStack_440._0_2_ = auVar127._8_2_;
                uStack_440._2_2_ = auVar127._10_2_;
                uStack_440._4_2_ = auVar127._12_2_;
                uStack_440._6_2_ = auVar127._14_2_;
                uVar13 = CONCAT13((0 < local_448._6_2_) * (local_448._6_2_ < 0x100) * auVar127[6] -
                                  (0xff < local_448._6_2_),
                                  CONCAT12((0 < local_448._4_2_) * (local_448._4_2_ < 0x100) *
                                           auVar127[4] - (0xff < local_448._4_2_),
                                           CONCAT11((0 < local_448._2_2_) *
                                                    (local_448._2_2_ < 0x100) * auVar127[2] -
                                                    (0xff < local_448._2_2_),
                                                    (0 < (short)local_448) *
                                                    ((short)local_448 < 0x100) * auVar127[0] -
                                                    (0xff < (short)local_448))));
                uStack_22c8 = CONCAT17((0 < uStack_440._6_2_) * (uStack_440._6_2_ < 0x100) *
                                       auVar127[0xe] - (0xff < uStack_440._6_2_),
                                       CONCAT16((0 < uStack_440._4_2_) * (uStack_440._4_2_ < 0x100)
                                                * auVar127[0xc] - (0xff < uStack_440._4_2_),
                                                CONCAT15((0 < uStack_440._2_2_) *
                                                         (uStack_440._2_2_ < 0x100) * auVar127[10] -
                                                         (0xff < uStack_440._2_2_),
                                                         CONCAT14((0 < (short)uStack_440) *
                                                                  ((short)uStack_440 < 0x100) *
                                                                  auVar127[8] -
                                                                  (0xff < (short)uStack_440),uVar13)
                                                        )));
                s0_2[0] = CONCAT17((0 < uStack_440._6_2_) * (uStack_440._6_2_ < 0x100) *
                                   auVar127[0xe] - (0xff < uStack_440._6_2_),
                                   CONCAT16((0 < uStack_440._4_2_) * (uStack_440._4_2_ < 0x100) *
                                            auVar127[0xc] - (0xff < uStack_440._4_2_),
                                            CONCAT15((0 < uStack_440._2_2_) *
                                                     (uStack_440._2_2_ < 0x100) * auVar127[10] -
                                                     (0xff < uStack_440._2_2_),
                                                     CONCAT14((0 < (short)uStack_440) *
                                                              ((short)uStack_440 < 0x100) *
                                                              auVar127[8] -
                                                              (0xff < (short)uStack_440),
                                                              CONCAT13((0 < local_448._6_2_) *
                                                                       (local_448._6_2_ < 0x100) *
                                                                       auVar127[6] -
                                                                       (0xff < local_448._6_2_),
                                                                       CONCAT12((0 < local_448._4_2_
                                                                                ) * (local_448._4_2_
                                                                                    < 0x100) *
                                                                                auVar127[4] -
                                                                                (0xff < local_448.
                                                                                        _4_2_),
                                                                                CONCAT11((0 < 
                                                  local_448._2_2_) * (local_448._2_2_ < 0x100) *
                                                  auVar127[2] - (0xff < local_448._2_2_),
                                                  (0 < (short)local_448) *
                                                  ((short)local_448 < 0x100) * auVar127[0] -
                                                  (0xff < (short)local_448))))))));
                *(undefined4 *)(dstStride + local_21f0 * 4) = uVar13;
                local_17f0 = local_1800;
                local_1598 = ZEXT416(local_1584);
                local_11b8 = uStack_22c8;
                lStack_11b0 = s0_2[0];
                local_11a8 = uStack_22c8;
                lStack_11a0 = s0_2[0];
                local_1038 = uVar71;
                uStack_1030 = uVar107;
                local_1028 = local_2868;
                uStack_1020 = uStack_2860;
                local_948 = uVar7;
                uStack_940 = uVar12;
                local_5c8 = local_1818;
                uStack_5c0 = uStack_1810;
                local_448 = local_28a8;
                uStack_440 = uStack_28a0;
              }
            }
          }
        }
        uStack_fd0 = uVar72;
        local_fd8 = uVar53;
        xOffset = sVar5;
        s0_3[1] = lVar6;
        m1[0] = lVar51;
        m1[1] = lVar52;
        x1 = uVar60;
        if (uVar60 == 0) {
          local_2510 = (unsigned_long)*(int *)(this + 0x30);
          uStack_2518 = it._xorMask + 0x400;
          uVar13 = s0_3[1]._4_4_;
          uVar16 = m1[0]._4_4_;
          uVar54 = m1[1]._4_4_;
          lVar6 = s0_3[1];
          s0_3[1]._4_4_ = uVar13;
          lVar51 = m1[0];
          m1[0]._4_4_ = uVar16;
          lVar52 = m1[1];
          m1[1]._4_4_ = uVar54;
          puVar63 = std::min<unsigned_long>(&local_2510,&stack0xffffffffffffdae8);
          uVar54 = m1[1]._4_4_;
          uVar16 = m1[0]._4_4_;
          uVar13 = s0_3[1]._4_4_;
          uStack_2500 = *puVar63;
        }
        else {
          if (uVar60 == 0) {
            uVar13 = s0_3[1]._4_4_;
            uVar16 = m1[0]._4_4_;
            uVar54 = m1[1]._4_4_;
            lVar6 = s0_3[1];
            s0_3[1]._4_4_ = uVar13;
            lVar51 = m1[0];
            m1[0]._4_4_ = uVar16;
            lVar52 = m1[1];
            m1[1]._4_4_ = uVar54;
            __assert_fail("bitWord != T(0)",
                          "/workspace/llm4binary/github/license_c_cmakelists/kobalicek[P]b2drefras/./intutils.h"
                          ,0x151,
                          "size_t IntUtils::BitWordFlipIterator<unsigned long>::nextAndFlip() [T = unsigned long]"
                         );
          }
          uVar13 = s0_3[1]._4_4_;
          uVar16 = m1[0]._4_4_;
          uVar54 = m1[1]._4_4_;
          lVar6 = s0_3[1];
          s0_3[1]._4_4_ = uVar13;
          lVar51 = m1[0];
          m1[0]._4_4_ = uVar16;
          lVar52 = m1[1];
          m1[1]._4_4_ = uVar54;
          uVar56 = IntUtils::ctz<unsigned_long>(uVar60);
          uVar54 = m1[1]._4_4_;
          uVar16 = m1[0]._4_4_;
          uVar13 = s0_3[1]._4_4_;
          lVar6 = s0_3[1];
          s0_3[1]._4_4_ = uVar13;
          lVar51 = m1[0];
          m1[0]._4_4_ = uVar16;
          lVar52 = m1[1];
          m1[1]._4_4_ = uVar54;
          uVar62 = IntUtils::allOnes<unsigned_long>();
          uVar54 = m1[1]._4_4_;
          uVar16 = m1[0]._4_4_;
          uVar13 = s0_3[1]._4_4_;
          lVar6 = s0_3[1];
          s0_3[1]._4_4_ = uVar13;
          lVar51 = m1[0];
          m1[0]._4_4_ = uVar16;
          lVar52 = m1[1];
          m1[1]._4_4_ = uVar54;
          uVar61 = IntUtils::allOnes<unsigned_long>();
          uVar54 = m1[1]._4_4_;
          uVar16 = m1[0]._4_4_;
          uVar13 = s0_3[1]._4_4_;
          it._bitWord = uVar61 ^ it._bitWord;
          uStack_2500 = uVar59 + (ulong)uVar56 * 0x10;
          x1 = uVar62 << ((byte)uVar56 & 0x3f) ^ uVar60;
        }
        m1[1]._4_4_ = uVar54;
        m1[0]._4_4_ = uVar16;
        s0_3[1]._4_4_ = uVar13;
        uVar54 = m1[1]._4_4_;
        uVar16 = m1[0]._4_4_;
        uVar13 = s0_3[1]._4_4_;
        uVar53 = uStack_2500;
        local_2108 = xOffset;
        local_2008 = (ulong)x0._4_4_;
        i_1 = local_2008;
        coverXmm[0] = 0;
        local_2140 = uStack_2500 - xOffset >> 2;
        lVar6 = s0_3[1];
        lVar51 = m1[0];
        lVar52 = m1[1];
        if (local_2140 != 0) {
          i_1 = CONCAT44(x0._4_4_,x0._4_4_);
          coverXmm[0] = CONCAT44(x0._4_4_,x0._4_4_);
          uVar72 = s0_3[1];
          uVar60 = m1[0];
          uVar71 = m1[1];
          s0_3[1]._4_4_ = uVar13;
          m1[0]._4_4_ = uVar16;
          m1[1]._4_4_ = uVar54;
          for (; m1[1] = uVar71, m1[0] = uVar60, s0_3[1] = uVar72, uVar54 = m1[1]._4_4_,
              uVar16 = m1[0]._4_4_, uVar13 = s0_3[1]._4_4_, lVar6 = s0_3[1], lVar51 = m1[0],
              lVar52 = m1[1], local_2140 != 0; local_2140 = local_2140 - 1) {
            local_db0 = (undefined8 *)(compositor._u32[1] + local_2108 * 8);
            uVar72 = local_db0[1];
            m1[1]._0_4_ = (int)*local_db0;
            m1[1]._4_4_ = (undefined4)((ulong)*local_db0 >> 0x20);
            m0[0]._0_4_ = (int)uVar72;
            m0[0]._4_4_ = (int)(uVar72 >> 0x20);
            local_da8 = (undefined8 *)(compositor._u32[1] + (local_2108 + 2) * 8);
            local_388 = m1 + 1;
            local_390 = t1 + 1;
            t1[1]._0_4_ = (int)*local_da8;
            t1[1]._4_4_ = (undefined4)((ulong)*local_da8 >> 0x20);
            uVar13 = t1[1]._4_4_;
            t0[0]._0_4_ = (int)local_da8[1];
            iVar120 = (int)t0[0];
            t0[0]._4_4_ = (undefined4)((ulong)local_da8[1] >> 0x20);
            t1[1] = CONCAT44((int)t0[0],(int)t1[1]);
            t0[0] = CONCAT44(t0[0]._4_4_,uVar13);
            iStack_20c = m0[0]._4_4_;
            local_228 = t1[1];
            uStack_21c = t0[0]._4_4_;
            _local_218 = CONCAT44((int)m0[0],(undefined4)t0[1]);
            local_358 = m1 + 1;
            local_360 = t1 + 1;
            local_1f8 = CONCAT44((int)m0[0],(int)m1[1]);
            uStack_1f0 = CONCAT44(m0[0]._4_4_,m1[1]._4_4_);
            local_208 = t1[1];
            lStack_200 = t0[0];
            local_350 = m1 + 1;
            local_1a8 = CONCAT44((int)m0[0],(int)m1[1]) << 0x20;
            uStack_1a0 = CONCAT44(iVar120,(int)t1[1]) << 0x20 | uVar72 & 0xffffffff;
            local_320 = m1 + 1;
            local_328 = t1 + 1;
            local_198 = CONCAT44((int)m0[0],(int)m1[1]);
            uStack_190 = CONCAT44(iVar120,(int)t1[1]);
            iVar93 = (int)m0[0] + (int)m1[1];
            iVar106 = (int)t1[1] + (int)m0[0];
            iVar120 = iVar120 + (int)t1[1];
            local_308 = 0;
            uStack_300 = 0;
            local_1240 = (undefined8 *)(compositor._u32[1] + local_2108 * 8);
            local_1258 = 0;
            uStack_1250 = 0;
            *local_1240 = 0;
            local_1240[1] = 0;
            local_1220 = (undefined8 *)(compositor._u32[1] + (local_2108 + 2) * 8);
            local_1238 = 0;
            uStack_1230 = 0;
            *local_1220 = 0;
            local_1220[1] = 0;
            local_368 = t1 + 1;
            local_370 = m1 + 1;
            local_1d8 = 0;
            uStack_1d0 = 0;
            local_1e8 = CONCAT44(iVar93,(int)m1[1]);
            uStack_1e0 = CONCAT44(iVar120,iVar106);
            local_2f8 = s0_3 + 1;
            uStack_110 = CONCAT44(m0[0]._4_4_,iStack_210);
            local_11c = 9;
            local_118 = (int)local_2928;
            iStack_114 = (int)((ulong)local_2928 >> 0x20);
            auVar127 = ZEXT416(9);
            local_330 = m1 + 1;
            local_338 = t1 + 1;
            local_178 = CONCAT44(iVar93,(int)m1[1]);
            uStack_170 = CONCAT44(iVar120,iVar106);
            local_188 = 0;
            local_340 = &i_1;
            local_348 = m1 + 1;
            sVar5 = i_1;
            lVar6 = coverXmm[0];
            local_168 = CONCAT44(iVar93,(int)m1[1]);
            uStack_160 = CONCAT44(iVar120 + iVar93,iVar106 + (int)m1[1]);
            local_158._0_4_ = (int)i_1;
            local_158._4_4_ = (int)(i_1 >> 0x20);
            uStack_150._0_4_ = (int)coverXmm[0];
            uStack_150._4_4_ = (int)((ulong)coverXmm[0] >> 0x20);
            uStack_150._0_4_ = (int)uStack_150 + iVar106 + (int)m1[1];
            uStack_150._4_4_ = uStack_150._4_4_ + iVar120 + iVar93;
            local_d8 = CONCAT44(local_158._4_4_ + iVar93,(int)local_158 + (int)m1[1]);
            uStack_d0 = CONCAT44(uStack_150._4_4_,(int)uStack_150);
            local_2e0 = &i_1;
            local_2e8 = s0_3 + 1;
            local_e8 = CONCAT44(iStack_114 >> auVar127,local_118 >> auVar127);
            uStack_e0 = CONCAT44(m0[0]._4_4_ >> auVar127,iStack_210 >> auVar127);
            iVar120 = ((int)local_158 + (int)m1[1]) - (local_118 >> auVar127);
            iVar93 = (local_158._4_4_ + iVar93) - (iStack_114 >> auVar127);
            uStack_150._0_4_ = (int)uStack_150 - (iStack_210 >> auVar127);
            iVar106 = uStack_150._4_4_ - (m0[0]._4_4_ >> auVar127);
            local_2c8 = s0_3 + 1;
            local_b8 = CONCAT44(iVar93,iVar120);
            uStack_b0 = CONCAT44(iVar106,(int)uStack_150);
            auVar35._4_4_ = iVar93;
            auVar35._0_4_ = iVar120;
            auVar35._8_4_ = (int)uStack_150;
            auVar35._12_4_ = iVar106;
            auVar127 = pabsd(auVar35,auVar35);
            local_29a8 = auVar127._0_8_;
            uStack_29a0 = auVar127._8_8_;
            local_2b0 = m1 + 1;
            local_2b8 = m1 + 1;
            local_78 = local_29a8;
            uStack_70 = uStack_29a0;
            local_88 = local_29a8;
            uStack_80 = uStack_29a0;
            auVar127 = packssdw(auVar127,auVar127);
            local_29b8 = auVar127._0_8_;
            uStack_29b0 = auVar127._8_8_;
            local_290 = m1 + 1;
            local_298 = SIMD::(anonymous_namespace)::u16_00FF_128;
            local_48 = 0xff00ff00ff00ff;
            uStack_40 = 0xff00ff00ff00ff;
            local_38._0_2_ = auVar127._0_2_;
            local_38._2_2_ = auVar127._2_2_;
            local_38._4_2_ = auVar127._4_2_;
            local_38._6_2_ = auVar127._6_2_;
            uStack_30._0_2_ = auVar127._8_2_;
            uStack_30._2_2_ = auVar127._10_2_;
            uStack_30._4_2_ = auVar127._12_2_;
            uStack_30._6_2_ = auVar127._14_2_;
            uVar65 = (ushort)(0xff < (short)local_38) * 0xff |
                     (ushort)(0xff >= (short)local_38) * (short)local_38;
            uVar79 = (ushort)(0xff < local_38._2_2_) * 0xff |
                     (ushort)(0xff >= local_38._2_2_) * local_38._2_2_;
            uVar90 = (ushort)(0xff < local_38._4_2_) * 0xff |
                     (ushort)(0xff >= local_38._4_2_) * local_38._4_2_;
            uVar98 = (ushort)(0xff < local_38._6_2_) * 0xff |
                     (ushort)(0xff >= local_38._6_2_) * local_38._6_2_;
            uVar13 = CONCAT22(uVar79,uVar65);
            uVar16 = CONCAT22((ushort)(0xff < uStack_30._2_2_) * 0xff |
                              (ushort)(0xff >= uStack_30._2_2_) * uStack_30._2_2_,
                              (ushort)(0xff < (short)uStack_30) * 0xff |
                              (ushort)(0xff >= (short)uStack_30) * (short)uStack_30);
            m1[1]._4_4_ = (undefined4)(CONCAT26(uVar98,CONCAT24(uVar90,uVar13)) >> 0x20);
            m0[0]._4_4_ = (int)(CONCAT26((ushort)(0xff < uStack_30._6_2_) * 0xff |
                                         (ushort)(0xff >= uStack_30._6_2_) * uStack_30._6_2_,
                                         CONCAT24((ushort)(0xff < uStack_30._4_2_) * 0xff |
                                                  (ushort)(0xff >= uStack_30._4_2_) *
                                                  uStack_30._4_2_,uVar16)) >> 0x20);
            local_278 = m1 + 1;
            local_18 = CONCAT44(m1[1]._4_4_,uVar13);
            uStack_10 = CONCAT44(m0[0]._4_4_,uVar16);
            local_28 = CONCAT44(m1[1]._4_4_,uVar13);
            uStack_20 = CONCAT44(m0[0]._4_4_,uVar16);
            uVar13 = CONCAT22(uVar65,uVar65);
            uVar16 = CONCAT22(uVar90,uVar90);
            m1[1]._4_4_ = (undefined4)(CONCAT26(uVar79,CONCAT24(uVar79,uVar13)) >> 0x20);
            m0[0]._4_4_ = (int)(CONCAT26(uVar98,CONCAT24(uVar98,uVar16)) >> 0x20);
            local_268 = &i_1;
            i_1 = CONCAT44(uStack_150._4_4_,uStack_150._4_4_);
            coverXmm[0] = CONCAT44(uStack_150._4_4_,uStack_150._4_4_);
            local_260 = m1 + 1;
            local_da0 = (undefined1 (*) [16])(dstStride + local_2108 * 4);
            local_cc8 = *(undefined8 *)*local_da0;
            uVar7 = *(undefined8 *)(*local_da0 + 8);
            local_c58 = 0;
            uStack_c50 = 0;
            local_cd8 = 0;
            uStack_cd0 = 0;
            uStack_cc0._0_1_ = (byte)uVar7;
            uStack_cc0._1_1_ = (byte)((ulong)uVar7 >> 8);
            uStack_cc0._2_1_ = (byte)((ulong)uVar7 >> 0x10);
            uStack_cc0._3_1_ = (byte)((ulong)uVar7 >> 0x18);
            uStack_cc0._4_1_ = (byte)((ulong)uVar7 >> 0x20);
            uStack_cc0._5_1_ = (byte)((ulong)uVar7 >> 0x28);
            uStack_cc0._6_1_ = (byte)((ulong)uVar7 >> 0x30);
            uStack_cc0._7_1_ = (byte)((ulong)uVar7 >> 0x38);
            auVar127 = pmovzxbw(*local_da0,local_cc8);
            local_2a28 = auVar127._0_8_;
            uStack_2a20 = auVar127._8_8_;
            local_f08 = local_2558;
            uStack_f00 = uStack_2550;
            local_f18 = CONCAT44(uVar13,uVar13);
            uStack_f10 = CONCAT44(m1[1]._4_4_,m1[1]._4_4_);
            t1[1] = CONCAT26(sVar70 * uVar65,
                             CONCAT24(sVar69 * uVar65,CONCAT22(sVar68 * uVar65,sVar67 * uVar65)));
            t0[0] = CONCAT26(sVar85 * uVar79,
                             CONCAT24(sVar84 * uVar79,CONCAT22(sVar83 * uVar79,sVar82 * uVar79)));
            local_ee8 = local_2558;
            uStack_ee0 = uStack_2550;
            local_ef8 = CONCAT44(uVar16,uVar16);
            uStack_ef0 = CONCAT44(m0[0]._4_4_,m0[0]._4_4_);
            local_828 = CONCAT26(sVar70 * uVar90,
                                 CONCAT24(sVar69 * uVar90,CONCAT22(sVar68 * uVar90,sVar67 * uVar90))
                                );
            t1[0] = CONCAT26(sVar85 * uVar98,
                             CONCAT24(sVar84 * uVar98,CONCAT22(sVar83 * uVar98,sVar82 * uVar98)));
            local_e28 = CONCAT44(uVar13,uVar13);
            uStack_e20 = CONCAT44(m1[1]._4_4_,m1[1]._4_4_);
            local_e38 = 0xff00ff00ff00ff;
            uStack_e30 = 0xff00ff00ff00ff;
            uVar71 = local_e28 ^ 0xff00ff00ff00ff;
            uVar107 = uStack_e20 ^ 0xff00ff00ff00ff;
            m1[1]._4_4_ = (undefined4)(uVar71 >> 0x20);
            local_e08 = CONCAT44(uVar16,uVar16);
            uStack_e00 = CONCAT44(m0[0]._4_4_,m0[0]._4_4_);
            local_e18 = 0xff00ff00ff00ff;
            uStack_e10 = 0xff00ff00ff00ff;
            uVar72 = local_e08 ^ 0xff00ff00ff00ff;
            uVar60 = uStack_e00 ^ 0xff00ff00ff00ff;
            s0_3[1]._4_4_ = (undefined4)(uVar72 >> 0x20);
            m1[0]._4_4_ = (undefined4)(uVar60 >> 0x20);
            local_ec8._0_2_ = auVar127._0_2_;
            local_ec8._2_2_ = auVar127._2_2_;
            local_ec8._4_2_ = auVar127._4_2_;
            local_ec8._6_2_ = auVar127._6_2_;
            uStack_ec0._0_2_ = auVar127._8_2_;
            uStack_ec0._2_2_ = auVar127._10_2_;
            uStack_ec0._4_2_ = auVar127._12_2_;
            uStack_ec0._6_2_ = auVar127._14_2_;
            local_ed8._0_2_ = (short)uVar71;
            local_ed8._2_2_ = (short)(uVar71 >> 0x10);
            local_ed8._4_2_ = (short)(uVar71 >> 0x20);
            local_ed8._6_2_ = (short)(uVar71 >> 0x30);
            uStack_ed0._0_2_ = (short)uVar107;
            uStack_ed0._2_2_ = (short)(uVar107 >> 0x10);
            uStack_ed0._4_2_ = (short)(uVar107 >> 0x20);
            uStack_ed0._6_2_ = (short)(uVar107 >> 0x30);
            local_838 = CONCAT26(local_ec8._6_2_ * local_ed8._6_2_,
                                 CONCAT24(local_ec8._4_2_ * local_ed8._4_2_,
                                          CONCAT22(local_ec8._2_2_ * local_ed8._2_2_,
                                                   (short)local_ec8 * (short)local_ed8)));
            uStack_830 = CONCAT26(uStack_ec0._6_2_ * uStack_ed0._6_2_,
                                  CONCAT24(uStack_ec0._4_2_ * uStack_ed0._4_2_,
                                           CONCAT22(uStack_ec0._2_2_ * uStack_ed0._2_2_,
                                                    (short)uStack_ec0 * (short)uStack_ed0)));
            local_ea8._2_2_ = (ushort)uStack_cc0._1_1_;
            local_ea8._4_2_ = (ushort)uStack_cc0._2_1_;
            local_ea8._6_2_ = (ushort)uStack_cc0._3_1_;
            uStack_ea0._2_2_ = (ushort)uStack_cc0._5_1_;
            uStack_ea0._4_2_ = (ushort)uStack_cc0._6_1_;
            uStack_ea0._6_2_ = (ushort)uStack_cc0._7_1_;
            local_eb8._0_2_ = (short)uVar72;
            local_eb8._2_2_ = (short)(uVar72 >> 0x10);
            local_eb8._4_2_ = (short)(uVar72 >> 0x20);
            local_eb8._6_2_ = (short)(uVar72 >> 0x30);
            uStack_eb0._0_2_ = (short)uVar60;
            uStack_eb0._2_2_ = (short)(uVar60 >> 0x10);
            uStack_eb0._4_2_ = (short)(uVar60 >> 0x20);
            uStack_eb0._6_2_ = (short)(uVar60 >> 0x30);
            local_eb8._0_2_ = (ushort)(byte)uStack_cc0 * (short)local_eb8;
            uStack_eb0._0_2_ = (ushort)uStack_cc0._4_1_ * (short)uStack_eb0;
            local_818 = CONCAT26(local_ea8._6_2_ * local_eb8._6_2_,
                                 CONCAT24(local_ea8._4_2_ * local_eb8._4_2_,
                                          CONCAT22(local_ea8._2_2_ * local_eb8._2_2_,
                                                   (short)local_eb8)));
            uStack_810 = CONCAT26(uStack_ea0._6_2_ * uStack_eb0._6_2_,
                                  CONCAT24(uStack_ea0._4_2_ * uStack_eb0._4_2_,
                                           CONCAT22(uStack_ea0._2_2_ * uStack_eb0._2_2_,
                                                    (short)uStack_eb0)));
            sVar66 = (short)local_ec8 * (short)local_ed8 + sVar67 * uVar65;
            sVar80 = local_ec8._2_2_ * local_ed8._2_2_ + sVar68 * uVar65;
            sVar91 = local_ec8._4_2_ * local_ed8._4_2_ + sVar69 * uVar65;
            sVar99 = local_ec8._6_2_ * local_ed8._6_2_ + sVar70 * uVar65;
            sVar105 = (short)uStack_ec0 * (short)uStack_ed0 + sVar82 * uVar79;
            sVar112 = uStack_ec0._2_2_ * uStack_ed0._2_2_ + sVar83 * uVar79;
            sVar118 = uStack_ec0._4_2_ * uStack_ed0._4_2_ + sVar84 * uVar79;
            sVar125 = uStack_ec0._6_2_ * uStack_ed0._6_2_ + sVar85 * uVar79;
            local_a58 = CONCAT26(sVar99,CONCAT24(sVar91,CONCAT22(sVar80,sVar66)));
            uStack_a50 = CONCAT26(sVar125,CONCAT24(sVar118,CONCAT22(sVar112,sVar105)));
            local_eb8._0_2_ = (short)local_eb8 + sVar67 * uVar90;
            sVar81 = local_ea8._2_2_ * local_eb8._2_2_ + sVar68 * uVar90;
            sVar92 = local_ea8._4_2_ * local_eb8._4_2_ + sVar69 * uVar90;
            sVar100 = local_ea8._6_2_ * local_eb8._6_2_ + sVar70 * uVar90;
            uStack_eb0._0_2_ = (short)uStack_eb0 + sVar82 * uVar98;
            sVar113 = uStack_ea0._2_2_ * uStack_eb0._2_2_ + sVar83 * uVar98;
            sVar119 = uStack_ea0._4_2_ * uStack_eb0._4_2_ + sVar84 * uVar98;
            sVar126 = uStack_ea0._6_2_ * uStack_eb0._6_2_ + sVar85 * uVar98;
            local_a38 = CONCAT26(sVar100,CONCAT24(sVar92,CONCAT22(sVar81,(short)local_eb8)));
            uStack_a30 = CONCAT26(sVar126,CONCAT24(sVar119,CONCAT22(sVar113,(short)uStack_eb0)));
            local_1980 = s1_2 + 1;
            local_1978 = SIMD::(anonymous_namespace)::u16_0080_128;
            local_a68 = 0x80008000800080;
            uStack_a60 = 0x80008000800080;
            local_1998 = CONCAT26(sVar99 + 0x80,
                                  CONCAT24(sVar91 + 0x80,CONCAT22(sVar80 + 0x80,sVar66 + 0x80)));
            uStack_1990 = CONCAT26(sVar125 + 0x80,
                                   CONCAT24(sVar118 + 0x80,CONCAT22(sVar112 + 0x80,sVar105 + 0x80)))
            ;
            local_710 = &local_1998;
            local_718 = SIMD::(anonymous_namespace)::u16_0101_128;
            auVar37._8_8_ = uStack_1990;
            auVar37._0_8_ = local_1998;
            local_6d8 = 0x101010101010101;
            uStack_6d0 = 0x101010101010101;
            auVar18._8_8_ = 0x101010101010101;
            auVar18._0_8_ = 0x101010101010101;
            auVar127 = pmulhuw(auVar37,auVar18);
            local_2ac8 = auVar127._0_8_;
            uStack_2ac0 = auVar127._8_8_;
            local_19b0 = t0 + 1;
            local_19a8 = SIMD::(anonymous_namespace)::u16_0080_128;
            local_a48 = 0x80008000800080;
            uStack_a40 = 0x80008000800080;
            local_19c8 = CONCAT26(sVar100 + 0x80,
                                  CONCAT24(sVar92 + 0x80,
                                           CONCAT22(sVar81 + 0x80,(short)local_eb8 + 0x80)));
            uStack_19c0 = CONCAT26(sVar126 + 0x80,
                                   CONCAT24(sVar119 + 0x80,
                                            CONCAT22(sVar113 + 0x80,(short)uStack_eb0 + 0x80)));
            local_700 = &local_19c8;
            local_708 = SIMD::(anonymous_namespace)::u16_0101_128;
            auVar36._8_8_ = uStack_19c0;
            auVar36._0_8_ = local_19c8;
            local_6f8 = 0x101010101010101;
            uStack_6f0 = 0x101010101010101;
            auVar17._8_8_ = 0x101010101010101;
            auVar17._0_8_ = 0x101010101010101;
            auVar76 = pmulhuw(auVar36,auVar17);
            local_2ae8 = auVar76._0_8_;
            t0[1] = local_2ae8;
            lStack_2ae0 = auVar76._8_8_;
            s1_2[0] = lStack_2ae0;
            local_1698 = s1_2 + 1;
            local_16a0 = t0 + 1;
            local_3a8._0_2_ = auVar127._0_2_;
            local_3a8._2_2_ = auVar127._2_2_;
            local_3a8._4_2_ = auVar127._4_2_;
            local_3a8._6_2_ = auVar127._6_2_;
            uStack_3a0._0_2_ = auVar127._8_2_;
            uStack_3a0._2_2_ = auVar127._10_2_;
            uStack_3a0._4_2_ = auVar127._12_2_;
            uStack_3a0._6_2_ = auVar127._14_2_;
            local_3b8._0_2_ = auVar76._0_2_;
            local_3b8._2_2_ = auVar76._2_2_;
            local_3b8._4_2_ = auVar76._4_2_;
            local_3b8._6_2_ = auVar76._6_2_;
            uStack_3b0._0_2_ = auVar76._8_2_;
            uStack_3b0._2_2_ = auVar76._10_2_;
            uStack_3b0._4_2_ = auVar76._12_2_;
            uStack_3b0._6_2_ = auVar76._14_2_;
            s1_2[1] = CONCAT17((0 < uStack_3a0._6_2_) * (uStack_3a0._6_2_ < 0x100) * auVar127[0xe] -
                               (0xff < uStack_3a0._6_2_),
                               CONCAT16((0 < uStack_3a0._4_2_) * (uStack_3a0._4_2_ < 0x100) *
                                        auVar127[0xc] - (0xff < uStack_3a0._4_2_),
                                        CONCAT15((0 < uStack_3a0._2_2_) * (uStack_3a0._2_2_ < 0x100)
                                                 * auVar127[10] - (0xff < uStack_3a0._2_2_),
                                                 CONCAT14((0 < (short)uStack_3a0) *
                                                          ((short)uStack_3a0 < 0x100) * auVar127[8]
                                                          - (0xff < (short)uStack_3a0),
                                                          CONCAT13((0 < local_3a8._6_2_) *
                                                                   (local_3a8._6_2_ < 0x100) *
                                                                   auVar127[6] -
                                                                   (0xff < local_3a8._6_2_),
                                                                   CONCAT12((0 < local_3a8._4_2_) *
                                                                            (local_3a8._4_2_ < 0x100
                                                                            ) * auVar127[4] -
                                                                            (0xff < local_3a8._4_2_)
                                                                            ,CONCAT11((0 < local_3a8
                                                  ._2_2_) * (local_3a8._2_2_ < 0x100) * auVar127[2]
                                                  - (0xff < local_3a8._2_2_),
                                                  (0 < (short)local_3a8) *
                                                  ((short)local_3a8 < 0x100) * auVar127[0] -
                                                  (0xff < (short)local_3a8))))))));
            s0_3[0] = CONCAT17((0 < uStack_3b0._6_2_) * (uStack_3b0._6_2_ < 0x100) * auVar76[0xe] -
                               (0xff < uStack_3b0._6_2_),
                               CONCAT16((0 < uStack_3b0._4_2_) * (uStack_3b0._4_2_ < 0x100) *
                                        auVar76[0xc] - (0xff < uStack_3b0._4_2_),
                                        CONCAT15((0 < uStack_3b0._2_2_) * (uStack_3b0._2_2_ < 0x100)
                                                 * auVar76[10] - (0xff < uStack_3b0._2_2_),
                                                 CONCAT14((0 < (short)uStack_3b0) *
                                                          ((short)uStack_3b0 < 0x100) * auVar76[8] -
                                                          (0xff < (short)uStack_3b0),
                                                          CONCAT13((0 < local_3b8._6_2_) *
                                                                   (local_3b8._6_2_ < 0x100) *
                                                                   auVar76[6] -
                                                                   (0xff < local_3b8._6_2_),
                                                                   CONCAT12((0 < local_3b8._4_2_) *
                                                                            (local_3b8._4_2_ < 0x100
                                                                            ) * auVar76[4] -
                                                                            (0xff < local_3b8._4_2_)
                                                                            ,CONCAT11((0 < local_3b8
                                                  ._2_2_) * (local_3b8._2_2_ < 0x100) * auVar76[2] -
                                                  (0xff < local_3b8._2_2_),
                                                  (0 < (short)local_3b8) *
                                                  ((short)local_3b8 < 0x100) * auVar76[0] -
                                                  (0xff < (short)local_3b8))))))));
            local_1200 = (longlong *)(dstStride + local_2108 * 4);
            *local_1200 = s1_2[1];
            local_1200[1] = s0_3[0];
            local_2108 = local_2108 + 4;
            local_19a0 = local_19b0;
            local_1970 = local_1980;
            local_1218 = s1_2[1];
            lStack_1210 = s0_3[0];
            local_ed8 = uVar71;
            uStack_ed0 = uVar107;
            local_ec8 = local_2a28;
            uStack_ec0 = uStack_2a20;
            local_eb8 = uVar72;
            uStack_eb0 = uVar60;
            local_ea8 = (ulong)CONCAT16(uStack_cc0._3_1_,
                                        (uint6)CONCAT14(uStack_cc0._2_1_,
                                                        (uint)CONCAT12(uStack_cc0._1_1_,
                                                                       (ushort)(byte)uStack_cc0)));
            uStack_ea0 = (ulong)CONCAT16(uStack_cc0._7_1_,
                                         (uint6)CONCAT14(uStack_cc0._6_1_,
                                                         (uint)CONCAT12(uStack_cc0._5_1_,
                                                                        (ushort)uStack_cc0._4_1_)));
            uStack_cc0 = uVar7;
            local_848 = t1[1];
            lStack_840 = t0[0];
            lStack_820 = t1[0];
            local_6e8 = local_19c8;
            uStack_6e0 = uStack_19c0;
            local_6c8 = local_1998;
            uStack_6c0 = uStack_1990;
            local_3b8 = local_2ae8;
            uStack_3b0 = lStack_2ae0;
            local_3a8 = local_2ac8;
            uStack_3a0 = uStack_2ac0;
            local_380 = local_390;
            local_378 = local_388;
            local_270 = local_278;
            local_258 = local_260;
            uStack_180 = local_1e8;
            local_158 = sVar5;
            uStack_150 = lVar6;
            local_38 = local_29b8;
            uStack_30 = uStack_29b0;
          }
        }
        for (; m1[1]._4_4_ = uVar54, m1[0]._4_4_ = uVar16, s0_3[1]._4_4_ = uVar13, m1[1] = lVar52,
            m1[0] = lVar51, s0_3[1] = lVar6, sVar5 = local_1b8, uVar54 = m1[1]._4_4_,
            uVar16 = m1[0]._4_4_, uVar13 = s0_3[1]._4_4_, local_1b8._0_4_ = (uint)i_1,
            local_2108 < uVar53; local_2108 = local_2108 + 1) {
          local_15c0 = (uint *)(compositor._u32[1] + local_2108 * 8);
          local_15a4 = *local_15c0;
          local_15b8._4_4_ = 0;
          local_15b8._0_4_ = local_15a4;
          uStack_21d8 = local_15b8._0_8_;
          t0_1[0] = 0;
          local_15e0 = (uint *)(compositor._u32[1] + 4 + local_2108 * 8);
          uVar2 = *local_15e0;
          local_15d8._4_4_ = 0;
          local_15d8._0_4_ = uVar2;
          uVar7 = local_15d8._0_8_;
          local_310 = &i_1;
          local_318 = &uStack_21d8;
          sVar5 = i_1;
          lStack_1b0 = coverXmm[0];
          local_1c8 = local_15b8._0_8_;
          uStack_1c0 = 0;
          local_1b8._4_4_ = (undefined4)(i_1 >> 0x20);
          i_1 = CONCAT44(local_1b8._4_4_,(uint)local_1b8 + local_15a4);
          local_15d8 = ZEXT416(uVar2);
          local_15c4 = uVar2;
          local_15b8 = ZEXT416(local_15a4);
          local_1b8 = sVar5;
          lVar6 = s0_3[1];
          s0_3[1]._4_4_ = uVar13;
          lVar51 = m1[0];
          m1[0]._4_4_ = uVar16;
          lVar52 = m1[1];
          m1[1]._4_4_ = uVar54;
          Cell::reset((Cell *)(compositor._u32[1] + local_2108 * 8));
          lVar52 = m1[1];
          lVar51 = m1[0];
          lVar6 = s0_3[1];
          local_2f0 = s0_4 + 1;
          local_138 = uVar7;
          uStack_130 = 0;
          local_13c = 9;
          auVar127 = ZEXT416(9);
          local_108 = CONCAT44(0 >> auVar127,(int)uVar2 >> auVar127);
          uStack_100 = CONCAT44(0 >> auVar127,0 >> auVar127);
          local_2d0 = &i_1;
          local_2d8 = s0_4 + 1;
          local_f8._0_4_ = (int)i_1;
          local_f8._4_4_ = (int)(i_1 >> 0x20);
          uStack_f0._0_4_ = (int)coverXmm[0];
          uStack_f0._4_4_ = (int)((ulong)coverXmm[0] >> 0x20);
          local_c8 = CONCAT44(local_f8._4_4_ - (0 >> auVar127),
                              (int)local_f8 - ((int)uVar2 >> auVar127));
          uStack_c0 = CONCAT44(uStack_f0._4_4_ - (0 >> auVar127),(int)uStack_f0 - (0 >> auVar127));
          m0_1[0] = uStack_c0;
          s0_4[1] = local_c8;
          local_2c0 = s0_4 + 1;
          auVar127 = pabsd(stack0xffffffffffffde48,stack0xffffffffffffde48);
          local_2a0 = s0_4 + 1;
          local_2a8 = s0_4 + 1;
          s0_4[1] = auVar127._0_8_;
          local_98 = s0_4[1];
          m0_1[0] = auVar127._8_8_;
          lStack_90 = m0_1[0];
          local_a8 = s0_4[1];
          lStack_a0 = m0_1[0];
          auVar127 = packssdw(auVar127,auVar127);
          local_280 = s0_4 + 1;
          local_288 = SIMD::(anonymous_namespace)::u16_00FF_128;
          s0_4[1] = auVar127._0_8_;
          lVar8 = s0_4[1];
          m0_1[0] = auVar127._8_8_;
          lVar9 = m0_1[0];
          local_68 = 0xff00ff00ff00ff;
          uStack_60 = 0xff00ff00ff00ff;
          local_58._0_2_ = auVar127._0_2_;
          local_58._2_2_ = auVar127._2_2_;
          local_58._4_2_ = auVar127._4_2_;
          local_58._6_2_ = auVar127._6_2_;
          uStack_50._0_2_ = auVar127._8_2_;
          uStack_50._2_2_ = auVar127._10_2_;
          uStack_50._4_2_ = auVar127._12_2_;
          uStack_50._6_2_ = auVar127._14_2_;
          s0_4[1]._2_2_ =
               (ushort)(0xff < local_58._2_2_) * 0xff |
               (ushort)(0xff >= local_58._2_2_) * local_58._2_2_;
          s0_4[1]._0_2_ =
               (ushort)(0xff < (short)local_58) * 0xff |
               (ushort)(0xff >= (short)local_58) * (short)local_58;
          s0_4[1]._4_2_ =
               (ushort)(0xff < local_58._4_2_) * 0xff |
               (ushort)(0xff >= local_58._4_2_) * local_58._4_2_;
          s0_4[1]._6_2_ =
               (ushort)(0xff < local_58._6_2_) * 0xff |
               (ushort)(0xff >= local_58._6_2_) * local_58._6_2_;
          m0_1[0]._2_2_ =
               (ushort)(0xff < uStack_50._2_2_) * 0xff |
               (ushort)(0xff >= uStack_50._2_2_) * uStack_50._2_2_;
          m0_1[0]._0_2_ =
               (ushort)(0xff < (short)uStack_50) * 0xff |
               (ushort)(0xff >= (short)uStack_50) * (short)uStack_50;
          m0_1[0]._4_2_ =
               (ushort)(0xff < uStack_50._4_2_) * 0xff |
               (ushort)(0xff >= uStack_50._4_2_) * uStack_50._4_2_;
          m0_1[0]._6_2_ =
               (ushort)(0xff < uStack_50._6_2_) * 0xff |
               (ushort)(0xff >= uStack_50._6_2_) * uStack_50._6_2_;
          local_1600 = (uint *)(dstStride + local_2108 * 4);
          local_15e4 = *local_1600;
          local_15f8._4_4_ = 0;
          local_15f8._0_4_ = local_15e4;
          auVar127 = pshuflw(stack0xffffffffffffde48,stack0xffffffffffffde48,0);
          auVar34._8_8_ = 0;
          auVar34._0_8_ = local_15f8._0_8_;
          auVar76 = pmovzxbw(auVar34,local_15f8._0_8_);
          local_2b68 = auVar76._0_8_;
          uStack_2b60 = auVar76._8_8_;
          s0_4[1] = auVar127._0_8_;
          lVar10 = s0_4[1];
          m0_1[0] = auVar127._8_8_;
          lVar11 = m0_1[0];
          local_f58 = local_2558;
          uStack_f50 = uStack_2550;
          local_f48._0_2_ = auVar127._0_2_;
          local_f48._2_2_ = auVar127._2_2_;
          local_f48._4_2_ = auVar127._4_2_;
          local_f48._6_2_ = auVar127._6_2_;
          uStack_f40._0_2_ = auVar127._8_2_;
          uStack_f40._2_2_ = auVar127._10_2_;
          uStack_f40._4_2_ = auVar127._12_2_;
          uStack_f40._6_2_ = auVar127._14_2_;
          uStack_21d8 = CONCAT26(local_f48._6_2_ * sVar70,
                                 CONCAT24(local_f48._4_2_ * sVar69,
                                          CONCAT22(local_f48._2_2_ * sVar68,
                                                   (short)local_f48 * sVar67)));
          t0_1[0] = CONCAT26(uStack_f40._6_2_ * sVar85,
                             CONCAT24(uStack_f40._4_2_ * sVar84,
                                      CONCAT22(uStack_f40._2_2_ * sVar83,(short)uStack_f40 * sVar82)
                                     ));
          local_e48 = s0_4[1];
          lStack_e40 = m0_1[0];
          local_e58 = 0xff00ff00ff00ff;
          uStack_e50 = 0xff00ff00ff00ff;
          s0_4[1] = s0_4[1] ^ 0xff00ff00ff00ff;
          m0_1[0] = m0_1[0] ^ 0xff00ff00ff00ff;
          local_f28._0_2_ = auVar76._0_2_;
          local_f28._2_2_ = auVar76._2_2_;
          local_f28._4_2_ = auVar76._4_2_;
          local_f28._6_2_ = auVar76._6_2_;
          uStack_f20._0_2_ = auVar76._8_2_;
          uStack_f20._2_2_ = auVar76._10_2_;
          uStack_f20._4_2_ = auVar76._12_2_;
          uStack_f20._6_2_ = auVar76._14_2_;
          local_f38._0_2_ = (short)s0_4[1];
          local_f38._2_2_ = (short)((ulong)s0_4[1] >> 0x10);
          local_f38._4_2_ = (short)((ulong)s0_4[1] >> 0x20);
          local_f38._6_2_ = (short)((ulong)s0_4[1] >> 0x30);
          uStack_f30._0_2_ = (short)m0_1[0];
          uStack_f30._2_2_ = (short)((ulong)m0_1[0] >> 0x10);
          uStack_f30._4_2_ = (short)((ulong)m0_1[0] >> 0x20);
          uStack_f30._6_2_ = (short)((ulong)m0_1[0] >> 0x30);
          local_858 = CONCAT26(local_f28._6_2_ * local_f38._6_2_,
                               CONCAT24(local_f28._4_2_ * local_f38._4_2_,
                                        CONCAT22(local_f28._2_2_ * local_f38._2_2_,
                                                 (short)local_f28 * (short)local_f38)));
          uStack_850 = CONCAT26(uStack_f20._6_2_ * uStack_f30._6_2_,
                                CONCAT24(uStack_f20._4_2_ * uStack_f30._4_2_,
                                         CONCAT22(uStack_f20._2_2_ * uStack_f30._2_2_,
                                                  (short)uStack_f20 * (short)uStack_f30)));
          sVar66 = (short)local_f28 * (short)local_f38 + (short)local_f48 * sVar67;
          sVar80 = local_f28._2_2_ * local_f38._2_2_ + local_f48._2_2_ * sVar68;
          sVar81 = local_f28._4_2_ * local_f38._4_2_ + local_f48._4_2_ * sVar69;
          sVar91 = local_f28._6_2_ * local_f38._6_2_ + local_f48._6_2_ * sVar70;
          sVar92 = (short)uStack_f20 * (short)uStack_f30 + (short)uStack_f40 * sVar82;
          sVar99 = uStack_f20._2_2_ * uStack_f30._2_2_ + uStack_f40._2_2_ * sVar83;
          sVar100 = uStack_f20._4_2_ * uStack_f30._4_2_ + uStack_f40._4_2_ * sVar84;
          sVar105 = uStack_f20._6_2_ * uStack_f30._6_2_ + uStack_f40._6_2_ * sVar85;
          local_a78 = CONCAT26(sVar91,CONCAT24(sVar81,CONCAT22(sVar80,sVar66)));
          uStack_a70 = CONCAT26(sVar105,CONCAT24(sVar100,CONCAT22(sVar99,sVar92)));
          local_1950 = t0_1 + 1;
          local_1948 = SIMD::(anonymous_namespace)::u16_0080_128;
          local_a88 = 0x80008000800080;
          uStack_a80 = 0x80008000800080;
          local_1968 = CONCAT26(sVar91 + 0x80,
                                CONCAT24(sVar81 + 0x80,CONCAT22(sVar80 + 0x80,sVar66 + 0x80)));
          uStack_1960 = CONCAT26(sVar105 + 0x80,
                                 CONCAT24(sVar100 + 0x80,CONCAT22(sVar99 + 0x80,sVar92 + 0x80)));
          local_720 = &local_1968;
          local_728 = SIMD::(anonymous_namespace)::u16_0101_128;
          auVar38._8_8_ = uStack_1960;
          auVar38._0_8_ = local_1968;
          local_6b8 = 0x101010101010101;
          uStack_6b0 = 0x101010101010101;
          auVar19._8_8_ = 0x101010101010101;
          auVar19._0_8_ = 0x101010101010101;
          auVar127 = pmulhuw(auVar38,auVar19);
          local_2bc8 = auVar127._0_8_;
          uStack_2bc0 = auVar127._8_8_;
          local_1688 = t0_1 + 1;
          local_1690 = t0_1 + 1;
          local_3d8 = local_2bc8;
          uStack_3d0 = uStack_2bc0;
          local_3c8._0_2_ = auVar127._0_2_;
          local_3c8._2_2_ = auVar127._2_2_;
          local_3c8._4_2_ = auVar127._4_2_;
          local_3c8._6_2_ = auVar127._6_2_;
          uStack_3c0._0_2_ = auVar127._8_2_;
          uStack_3c0._2_2_ = auVar127._10_2_;
          uStack_3c0._4_2_ = auVar127._12_2_;
          uStack_3c0._6_2_ = auVar127._14_2_;
          uVar13 = CONCAT13((0 < local_3c8._6_2_) * (local_3c8._6_2_ < 0x100) * auVar127[6] -
                            (0xff < local_3c8._6_2_),
                            CONCAT12((0 < local_3c8._4_2_) * (local_3c8._4_2_ < 0x100) * auVar127[4]
                                     - (0xff < local_3c8._4_2_),
                                     CONCAT11((0 < local_3c8._2_2_) * (local_3c8._2_2_ < 0x100) *
                                              auVar127[2] - (0xff < local_3c8._2_2_),
                                              (0 < (short)local_3c8) * ((short)local_3c8 < 0x100) *
                                              auVar127[0] - (0xff < (short)local_3c8))));
          t0_1[1] = CONCAT17((0 < uStack_3c0._6_2_) * (uStack_3c0._6_2_ < 0x100) * auVar127[0xe] -
                             (0xff < uStack_3c0._6_2_),
                             CONCAT16((0 < uStack_3c0._4_2_) * (uStack_3c0._4_2_ < 0x100) *
                                      auVar127[0xc] - (0xff < uStack_3c0._4_2_),
                                      CONCAT15((0 < uStack_3c0._2_2_) * (uStack_3c0._2_2_ < 0x100) *
                                               auVar127[10] - (0xff < uStack_3c0._2_2_),
                                               CONCAT14((0 < (short)uStack_3c0) *
                                                        ((short)uStack_3c0 < 0x100) * auVar127[8] -
                                                        (0xff < (short)uStack_3c0),uVar13))));
          s0_4[0] = CONCAT17((0 < uStack_3c0._6_2_) * (uStack_3c0._6_2_ < 0x100) * auVar127[0xe] -
                             (0xff < uStack_3c0._6_2_),
                             CONCAT16((0 < uStack_3c0._4_2_) * (uStack_3c0._4_2_ < 0x100) *
                                      auVar127[0xc] - (0xff < uStack_3c0._4_2_),
                                      CONCAT15((0 < uStack_3c0._2_2_) * (uStack_3c0._2_2_ < 0x100) *
                                               auVar127[10] - (0xff < uStack_3c0._2_2_),
                                               CONCAT14((0 < (short)uStack_3c0) *
                                                        ((short)uStack_3c0 < 0x100) * auVar127[8] -
                                                        (0xff < (short)uStack_3c0),
                                                        CONCAT13((0 < local_3c8._6_2_) *
                                                                 (local_3c8._6_2_ < 0x100) *
                                                                 auVar127[6] -
                                                                 (0xff < local_3c8._6_2_),
                                                                 CONCAT12((0 < local_3c8._4_2_) *
                                                                          (local_3c8._4_2_ < 0x100)
                                                                          * auVar127[4] -
                                                                          (0xff < local_3c8._4_2_),
                                                                          CONCAT11((0 < local_3c8.
                                                                                        _2_2_) *
                                                                                   (local_3c8._2_2_
                                                                                   < 0x100) *
                                                                                   auVar127[2] -
                                                                                   (0xff < local_3c8
                                                  ._2_2_),(0 < (short)local_3c8) *
                                                          ((short)local_3c8 < 0x100) * auVar127[0] -
                                                          (0xff < (short)local_3c8))))))));
          *(undefined4 *)(dstStride + local_2108 * 4) = uVar13;
          local_1940 = local_1950;
          local_15f8 = ZEXT416(local_15e4);
          local_1178 = t0_1[1];
          lStack_1170 = s0_4[0];
          local_1168 = t0_1[1];
          lStack_1160 = s0_4[0];
          local_f48 = lVar10;
          uStack_f40 = lVar11;
          local_f38 = s0_4[1];
          uStack_f30 = m0_1[0];
          local_f28 = local_2b68;
          uStack_f20 = uStack_2b60;
          local_868 = uStack_21d8;
          lStack_860 = t0_1[0];
          local_6a8 = local_1968;
          uStack_6a0 = uStack_1960;
          local_3c8 = local_2bc8;
          uStack_3c0 = uStack_2bc0;
          local_f8 = i_1;
          uStack_f0 = coverXmm[0];
          local_58 = lVar8;
          uStack_50 = lVar9;
          uVar13 = s0_3[1]._4_4_;
          uVar16 = m1[0]._4_4_;
          uVar54 = m1[1]._4_4_;
        }
        local_250 = &i_1;
        local_248 = i_1;
        lStack_240 = coverXmm[0];
        x0._4_4_ = (uint)local_1b8;
        xOffset = uStack_2500;
        local_238 = local_248;
        lStack_230 = lStack_240;
        local_1b8 = sVar5;
      }
      it._xorMask = it._xorMask + 0x400;
      cellLine = cellLine + 1;
      cell = (Cell *)((long)&cell[-1].area + 3);
    } while (cell != (Cell *)0x0);
    uVar53 = local_10d8;
    uVar72 = uStack_10d0;
    if (xOffset < (ulong)(long)*(int *)(this + 0x30)) {
      local_23c0 = x0._4_4_;
      if ((int)x0._4_4_ < 0) {
        local_23c0 = -x0._4_4_;
      }
      if (0xff < (int)local_23c0) {
        local_23c0 = 0xff;
      }
      if (local_23c0 != 0) {
        uVar60 = (ulong)*(int *)(this + 0x30);
        local_22e0 = xOffset;
        mVal_1[1] = uVar60 - xOffset >> 2;
        if (local_23c0 == 0xff) {
          for (; 7 < (ulong)mVal_1[1]; mVal_1[1] = mVal_1[1] + -8) {
            local_14c0 = (undefined8 *)(dstStride + local_22e0 * 4);
            local_14d8 = CONCAT44(uVar55,uVar55);
            uStack_14d0 = CONCAT44(uVar55,uVar55);
            *local_14c0 = local_14d8;
            local_14c0[1] = uStack_14d0;
            lVar64 = dstStride + local_22e0 * 4;
            local_14a0 = (undefined8 *)(lVar64 + 0x10);
            local_14b8 = CONCAT44(uVar55,uVar55);
            uStack_14b0 = CONCAT44(uVar55,uVar55);
            *local_14a0 = local_14b8;
            *(undefined8 *)(lVar64 + 0x18) = uStack_14b0;
            lVar64 = dstStride + local_22e0 * 4;
            local_1480 = (undefined8 *)(lVar64 + 0x20);
            local_1498 = CONCAT44(uVar55,uVar55);
            uStack_1490 = CONCAT44(uVar55,uVar55);
            *local_1480 = local_1498;
            *(undefined8 *)(lVar64 + 0x28) = uStack_1490;
            lVar64 = dstStride + local_22e0 * 4;
            local_1460 = (undefined8 *)(lVar64 + 0x30);
            local_1478 = CONCAT44(uVar55,uVar55);
            uStack_1470 = CONCAT44(uVar55,uVar55);
            *local_1460 = local_1478;
            *(undefined8 *)(lVar64 + 0x38) = uStack_1470;
            lVar64 = dstStride + local_22e0 * 4;
            local_1440 = (undefined8 *)(lVar64 + 0x40);
            local_1458 = CONCAT44(uVar55,uVar55);
            uStack_1450 = CONCAT44(uVar55,uVar55);
            *local_1440 = local_1458;
            *(undefined8 *)(lVar64 + 0x48) = uStack_1450;
            lVar64 = dstStride + local_22e0 * 4;
            local_1420 = (undefined8 *)(lVar64 + 0x50);
            local_1438 = CONCAT44(uVar55,uVar55);
            uStack_1430 = CONCAT44(uVar55,uVar55);
            *local_1420 = local_1438;
            *(undefined8 *)(lVar64 + 0x58) = uStack_1430;
            lVar64 = dstStride + local_22e0 * 4;
            local_1400 = (undefined8 *)(lVar64 + 0x60);
            local_1418 = CONCAT44(uVar55,uVar55);
            uStack_1410 = CONCAT44(uVar55,uVar55);
            *local_1400 = local_1418;
            *(undefined8 *)(lVar64 + 0x68) = uStack_1410;
            lVar64 = dstStride + local_22e0 * 4;
            local_13e0 = (undefined8 *)(lVar64 + 0x70);
            local_13f8 = CONCAT44(uVar55,uVar55);
            uStack_13f0 = CONCAT44(uVar55,uVar55);
            *local_13e0 = local_13f8;
            *(undefined8 *)(lVar64 + 0x78) = uStack_13f0;
            local_22e0 = local_22e0 + 0x20;
          }
          for (; mVal_1[1] != 0; mVal_1[1] = mVal_1[1] + -1) {
            local_14e0 = (undefined8 *)(dstStride + local_22e0 * 4);
            local_14f8 = CONCAT44(uVar55,uVar55);
            uStack_14f0 = CONCAT44(uVar55,uVar55);
            *local_14e0 = local_14f8;
            local_14e0[1] = uStack_14f0;
            local_22e0 = local_22e0 + 4;
          }
          for (; local_22e0 < uVar60; local_22e0 = local_22e0 + 1) {
            local_11d8 = CONCAT44(uVar55,uVar55);
            uStack_11d0 = CONCAT44(uVar55,uVar55);
            *(uint32_t *)(dstStride + local_22e0 * 4) = uVar55;
            local_11c8 = local_11d8;
            uStack_11c0 = uStack_11d0;
          }
        }
        else {
          auVar127 = pshuflw(ZEXT416(local_23c0),ZEXT416(local_23c0),0);
          local_2318 = auVar127._0_4_;
          sStack_2308 = auVar127._0_2_;
          sStack_2306 = auVar127._2_2_;
          local_1158 = CONCAT26(sStack_2306,CONCAT24(sStack_2308,local_2318));
          uStack_1150 = CONCAT26(sStack_2306,CONCAT24(sStack_2308,local_2318));
          local_1148._0_2_ = (short)local_1148 * sStack_2308;
          local_1148._2_2_ = local_1148._2_2_ * sStack_2306;
          local_1148._4_2_ = local_1148._4_2_ * sStack_2308;
          local_1148._6_2_ = local_1148._6_2_ * sStack_2306;
          uStack_1140._0_2_ = (short)uStack_1140 * sStack_2308;
          uStack_1140._2_2_ = uStack_1140._2_2_ * sStack_2306;
          uStack_1140._4_2_ = uStack_1140._4_2_ * sStack_2308;
          uStack_1140._6_2_ = uStack_1140._6_2_ * sStack_2306;
          uVar3 = CONCAT26(local_1148._6_2_,
                           CONCAT24(local_1148._4_2_,CONCAT22(local_1148._2_2_,(short)local_1148)));
          uVar4 = CONCAT26(uStack_1140._6_2_,
                           CONCAT24(uStack_1140._4_2_,CONCAT22(uStack_1140._2_2_,(short)uStack_1140)
                                   ));
          local_e88 = sStack_2308;
          sStack_e86 = sStack_2306;
          sStack_e84 = sStack_2308;
          sStack_e82 = sStack_2306;
          sStack_e80 = sStack_2308;
          sStack_e7e = sStack_2306;
          sStack_e7c = sStack_2308;
          sStack_e7a = sStack_2306;
          local_e98 = 0xff00ff00ff00ff;
          uStack_e90 = 0xff00ff00ff00ff;
          uVar71 = CONCAT26(sStack_2306,CONCAT24(sStack_2308,local_2318)) ^ 0xff00ff00ff00ff;
          uVar107 = CONCAT26(sStack_2306,CONCAT24(sStack_2308,local_2318)) ^ 0xff00ff00ff00ff;
          while( true ) {
            uVar72 = uStack_10d0;
            uVar53 = local_10d8;
            local_10d8._0_2_ = (short)uVar71;
            local_10d8._2_2_ = (short)(uVar71 >> 0x10);
            local_10d8._4_2_ = (short)(uVar71 >> 0x20);
            local_10d8._6_2_ = (short)(uVar71 >> 0x30);
            uStack_10d0._0_2_ = (short)uVar107;
            uStack_10d0._2_2_ = (short)(uVar107 >> 0x10);
            uStack_10d0._4_2_ = (short)(uVar107 >> 0x20);
            uStack_10d0._6_2_ = (short)(uVar107 >> 0x30);
            if ((ulong)mVal_1[1] < 2) break;
            local_de0 = (undefined1 (*) [16])(dstStride + local_22e0 * 4);
            local_d68 = *(undefined8 *)*local_de0;
            uVar7 = *(undefined8 *)(*local_de0 + 8);
            lVar64 = dstStride + local_22e0 * 4;
            local_dd8 = (undefined1 (*) [16])(lVar64 + 0x10);
            local_d48 = *(undefined8 *)*local_dd8;
            uVar12 = *(undefined8 *)(lVar64 + 0x18);
            local_ca8 = 0;
            uStack_ca0 = 0;
            local_d78 = 0;
            uStack_d70 = 0;
            uStack_d60._0_1_ = (byte)uVar7;
            uStack_d60._1_1_ = (byte)((ulong)uVar7 >> 8);
            uStack_d60._2_1_ = (byte)((ulong)uVar7 >> 0x10);
            uStack_d60._3_1_ = (byte)((ulong)uVar7 >> 0x18);
            uStack_d60._4_1_ = (byte)((ulong)uVar7 >> 0x20);
            uStack_d60._5_1_ = (byte)((ulong)uVar7 >> 0x28);
            uStack_d60._6_1_ = (byte)((ulong)uVar7 >> 0x30);
            uStack_d60._7_1_ = (byte)((ulong)uVar7 >> 0x38);
            local_c98 = 0;
            uStack_c90 = 0;
            local_d58 = 0;
            uStack_d50 = 0;
            uStack_d40._0_1_ = (byte)uVar12;
            uStack_d40._1_1_ = (byte)((ulong)uVar12 >> 8);
            uStack_d40._2_1_ = (byte)((ulong)uVar12 >> 0x10);
            uStack_d40._3_1_ = (byte)((ulong)uVar12 >> 0x18);
            uStack_d40._4_1_ = (byte)((ulong)uVar12 >> 0x20);
            uStack_d40._5_1_ = (byte)((ulong)uVar12 >> 0x28);
            uStack_d40._6_1_ = (byte)((ulong)uVar12 >> 0x30);
            uStack_d40._7_1_ = (byte)((ulong)uVar12 >> 0x38);
            auVar127 = pmovzxbw(*local_de0,local_d68);
            local_2cb8 = auVar127._0_8_;
            uStack_2cb0 = auVar127._8_8_;
            auVar76 = pmovzxbw(*local_dd8,local_d48);
            local_2cc8 = auVar76._0_8_;
            uStack_2cc0 = auVar76._8_8_;
            local_10c8._2_2_ = (ushort)uStack_d60._1_1_;
            local_10c8._4_2_ = (ushort)uStack_d60._2_1_;
            local_10c8._6_2_ = (ushort)uStack_d60._3_1_;
            uStack_10c0._2_2_ = (ushort)uStack_d60._5_1_;
            uStack_10c0._4_2_ = (ushort)uStack_d60._6_1_;
            uStack_10c0._6_2_ = (ushort)uStack_d60._7_1_;
            sVar67 = (ushort)(byte)uStack_d60 * (short)local_10d8;
            sVar112 = (ushort)uStack_d60._4_1_ * (short)uStack_10d0;
            local_9b8 = CONCAT26(local_10c8._6_2_ * local_10d8._6_2_,
                                 CONCAT24(local_10c8._4_2_ * local_10d8._4_2_,
                                          CONCAT22(local_10c8._2_2_ * local_10d8._2_2_,sVar67)));
            uStack_9b0 = CONCAT26(uStack_10c0._6_2_ * uStack_10d0._6_2_,
                                  CONCAT24(uStack_10c0._4_2_ * uStack_10d0._4_2_,
                                           CONCAT22(uStack_10c0._2_2_ * uStack_10d0._2_2_,sVar112)))
            ;
            local_10a8._2_2_ = (ushort)uStack_d40._1_1_;
            local_10a8._4_2_ = (ushort)uStack_d40._2_1_;
            local_10a8._6_2_ = (ushort)uStack_d40._3_1_;
            uStack_10a0._2_2_ = (ushort)uStack_d40._5_1_;
            uStack_10a0._4_2_ = (ushort)uStack_d40._6_1_;
            uStack_10a0._6_2_ = (ushort)uStack_d40._7_1_;
            sVar68 = (ushort)(byte)uStack_d40 * (short)local_10d8;
            sVar113 = (ushort)uStack_d40._4_1_ * (short)uStack_10d0;
            local_998 = CONCAT26(local_10a8._6_2_ * local_10d8._6_2_,
                                 CONCAT24(local_10a8._4_2_ * local_10d8._4_2_,
                                          CONCAT22(local_10a8._2_2_ * local_10d8._2_2_,sVar68)));
            uStack_990 = CONCAT26(uStack_10a0._6_2_ * uStack_10d0._6_2_,
                                  CONCAT24(uStack_10a0._4_2_ * uStack_10d0._4_2_,
                                           CONCAT22(uStack_10a0._2_2_ * uStack_10d0._2_2_,sVar113)))
            ;
            local_1088._0_2_ = auVar127._0_2_;
            local_1088._2_2_ = auVar127._2_2_;
            local_1088._4_2_ = auVar127._4_2_;
            local_1088._6_2_ = auVar127._6_2_;
            uStack_1080._0_2_ = auVar127._8_2_;
            uStack_1080._2_2_ = auVar127._10_2_;
            uStack_1080._4_2_ = auVar127._12_2_;
            uStack_1080._6_2_ = auVar127._14_2_;
            local_978 = CONCAT26(local_1088._6_2_ * local_10d8._6_2_,
                                 CONCAT24(local_1088._4_2_ * local_10d8._4_2_,
                                          CONCAT22(local_1088._2_2_ * local_10d8._2_2_,
                                                   (short)local_1088 * (short)local_10d8)));
            uStack_970 = CONCAT26(uStack_1080._6_2_ * uStack_10d0._6_2_,
                                  CONCAT24(uStack_1080._4_2_ * uStack_10d0._4_2_,
                                           CONCAT22(uStack_1080._2_2_ * uStack_10d0._2_2_,
                                                    (short)uStack_1080 * (short)uStack_10d0)));
            local_1068._0_2_ = auVar76._0_2_;
            local_1068._2_2_ = auVar76._2_2_;
            local_1068._4_2_ = auVar76._4_2_;
            local_1068._6_2_ = auVar76._6_2_;
            uStack_1060._0_2_ = auVar76._8_2_;
            uStack_1060._2_2_ = auVar76._10_2_;
            uStack_1060._4_2_ = auVar76._12_2_;
            uStack_1060._6_2_ = auVar76._14_2_;
            local_958 = CONCAT26(local_1068._6_2_ * local_10d8._6_2_,
                                 CONCAT24(local_1068._4_2_ * local_10d8._4_2_,
                                          CONCAT22(local_1068._2_2_ * local_10d8._2_2_,
                                                   (short)local_1068 * (short)local_10d8)));
            uStack_950 = CONCAT26(uStack_1060._6_2_ * uStack_10d0._6_2_,
                                  CONCAT24(uStack_1060._4_2_ * uStack_10d0._4_2_,
                                           CONCAT22(uStack_1060._2_2_ * uStack_10d0._2_2_,
                                                    (short)uStack_1060 * (short)uStack_10d0)));
            sVar67 = sVar67 + (short)local_1148;
            sVar82 = local_10c8._2_2_ * local_10d8._2_2_ + local_1148._2_2_;
            sVar66 = local_10c8._4_2_ * local_10d8._4_2_ + local_1148._4_2_;
            sVar92 = local_10c8._6_2_ * local_10d8._6_2_ + local_1148._6_2_;
            sVar112 = sVar112 + (short)uStack_1140;
            sVar125 = uStack_10c0._2_2_ * uStack_10d0._2_2_ + uStack_1140._2_2_;
            sVar86 = uStack_10c0._4_2_ * uStack_10d0._4_2_ + uStack_1140._4_2_;
            sVar94 = uStack_10c0._6_2_ * uStack_10d0._6_2_ + uStack_1140._6_2_;
            local_bd8 = CONCAT26(sVar92,CONCAT24(sVar66,CONCAT22(sVar82,sVar67)));
            uStack_bd0 = CONCAT26(sVar94,CONCAT24(sVar86,CONCAT22(sVar125,sVar112)));
            sVar68 = sVar68 + (short)local_1148;
            sVar83 = local_10a8._2_2_ * local_10d8._2_2_ + local_1148._2_2_;
            sVar80 = local_10a8._4_2_ * local_10d8._4_2_ + local_1148._4_2_;
            sVar99 = local_10a8._6_2_ * local_10d8._6_2_ + local_1148._6_2_;
            sVar113 = sVar113 + (short)uStack_1140;
            sVar126 = uStack_10a0._2_2_ * uStack_10d0._2_2_ + uStack_1140._2_2_;
            sVar87 = uStack_10a0._4_2_ * uStack_10d0._4_2_ + uStack_1140._4_2_;
            sVar95 = uStack_10a0._6_2_ * uStack_10d0._6_2_ + uStack_1140._6_2_;
            local_bb8 = CONCAT26(sVar99,CONCAT24(sVar80,CONCAT22(sVar83,sVar68)));
            uStack_bb0 = CONCAT26(sVar95,CONCAT24(sVar87,CONCAT22(sVar126,sVar113)));
            sVar69 = (short)local_1088 * (short)local_10d8 + (short)local_1148;
            sVar84 = local_1088._2_2_ * local_10d8._2_2_ + local_1148._2_2_;
            sVar81 = local_1088._4_2_ * local_10d8._4_2_ + local_1148._4_2_;
            sVar100 = local_1088._6_2_ * local_10d8._6_2_ + local_1148._6_2_;
            sVar118 = (short)uStack_1080 * (short)uStack_10d0 + (short)uStack_1140;
            sVar77 = uStack_1080._2_2_ * uStack_10d0._2_2_ + uStack_1140._2_2_;
            sVar88 = uStack_1080._4_2_ * uStack_10d0._4_2_ + uStack_1140._4_2_;
            sVar96 = uStack_1080._6_2_ * uStack_10d0._6_2_ + uStack_1140._6_2_;
            local_b98 = CONCAT26(sVar100,CONCAT24(sVar81,CONCAT22(sVar84,sVar69)));
            uStack_b90 = CONCAT26(sVar96,CONCAT24(sVar88,CONCAT22(sVar77,sVar118)));
            sVar70 = (short)local_1068 * (short)local_10d8 + (short)local_1148;
            sVar85 = local_1068._2_2_ * local_10d8._2_2_ + local_1148._2_2_;
            sVar91 = local_1068._4_2_ * local_10d8._4_2_ + local_1148._4_2_;
            sVar105 = local_1068._6_2_ * local_10d8._6_2_ + local_1148._6_2_;
            sVar119 = (short)uStack_1060 * (short)uStack_10d0 + (short)uStack_1140;
            sVar78 = uStack_1060._2_2_ * uStack_10d0._2_2_ + uStack_1140._2_2_;
            sVar89 = uStack_1060._4_2_ * uStack_10d0._4_2_ + uStack_1140._4_2_;
            sVar97 = uStack_1060._6_2_ * uStack_10d0._6_2_ + uStack_1140._6_2_;
            local_b78 = CONCAT26(sVar105,CONCAT24(sVar91,CONCAT22(sVar85,sVar70)));
            uStack_b70 = CONCAT26(sVar97,CONCAT24(sVar89,CONCAT22(sVar78,sVar119)));
            local_1740 = s2_1 + 1;
            local_1738 = SIMD::(anonymous_namespace)::u16_0080_128;
            local_be8 = 0x80008000800080;
            uStack_be0 = 0x80008000800080;
            local_1758 = CONCAT26(sVar92 + 0x80,
                                  CONCAT24(sVar66 + 0x80,CONCAT22(sVar82 + 0x80,sVar67 + 0x80)));
            uStack_1750 = CONCAT26(sVar94 + 0x80,
                                   CONCAT24(sVar86 + 0x80,CONCAT22(sVar125 + 0x80,sVar112 + 0x80)));
            local_7d0 = &local_1758;
            local_7d8 = SIMD::(anonymous_namespace)::u16_0101_128;
            auVar47._8_8_ = uStack_1750;
            auVar47._0_8_ = local_1758;
            local_558 = 0x101010101010101;
            uStack_550 = 0x101010101010101;
            auVar28._8_8_ = 0x101010101010101;
            auVar28._0_8_ = 0x101010101010101;
            auVar127 = pmulhuw(auVar47,auVar28);
            local_2d68 = auVar127._0_8_;
            s2_1[1] = local_2d68;
            lStack_2d60 = auVar127._8_8_;
            s1_3[0] = lStack_2d60;
            local_1770 = s0_6 + 1;
            local_1768 = SIMD::(anonymous_namespace)::u16_0080_128;
            local_bc8 = 0x80008000800080;
            uStack_bc0 = 0x80008000800080;
            local_1788 = CONCAT26(sVar99 + 0x80,
                                  CONCAT24(sVar80 + 0x80,CONCAT22(sVar83 + 0x80,sVar68 + 0x80)));
            uStack_1780 = CONCAT26(sVar95 + 0x80,
                                   CONCAT24(sVar87 + 0x80,CONCAT22(sVar126 + 0x80,sVar113 + 0x80)));
            local_7c0 = &local_1788;
            local_7c8 = SIMD::(anonymous_namespace)::u16_0101_128;
            auVar46._8_8_ = uStack_1780;
            auVar46._0_8_ = local_1788;
            local_578 = 0x101010101010101;
            uStack_570 = 0x101010101010101;
            auVar27._8_8_ = 0x101010101010101;
            auVar27._0_8_ = 0x101010101010101;
            auVar76 = pmulhuw(auVar46,auVar27);
            local_2d88 = auVar76._0_8_;
            s0_6[1] = local_2d88;
            lStack_2d80 = auVar76._8_8_;
            s3_1[0] = lStack_2d80;
            local_17a0 = s1_3 + 1;
            local_1798 = SIMD::(anonymous_namespace)::u16_0080_128;
            local_ba8 = 0x80008000800080;
            uStack_ba0 = 0x80008000800080;
            local_17b8 = CONCAT26(sVar100 + 0x80,
                                  CONCAT24(sVar81 + 0x80,CONCAT22(sVar84 + 0x80,sVar69 + 0x80)));
            uStack_17b0 = CONCAT26(sVar96 + 0x80,
                                   CONCAT24(sVar88 + 0x80,CONCAT22(sVar77 + 0x80,sVar118 + 0x80)));
            local_7b0 = &local_17b8;
            local_7b8 = SIMD::(anonymous_namespace)::u16_0101_128;
            auVar45._8_8_ = uStack_17b0;
            auVar45._0_8_ = local_17b8;
            local_598 = 0x101010101010101;
            uStack_590 = 0x101010101010101;
            auVar26._8_8_ = 0x101010101010101;
            auVar26._0_8_ = 0x101010101010101;
            auVar74 = pmulhuw(auVar45,auVar26);
            local_2da8 = auVar74._0_8_;
            uStack_2da0 = auVar74._8_8_;
            local_17d0 = s3_1 + 1;
            local_17c8 = SIMD::(anonymous_namespace)::u16_0080_128;
            local_b88 = 0x80008000800080;
            uStack_b80 = 0x80008000800080;
            local_17e8 = CONCAT26(sVar105 + 0x80,
                                  CONCAT24(sVar91 + 0x80,CONCAT22(sVar85 + 0x80,sVar70 + 0x80)));
            uStack_17e0 = CONCAT26(sVar97 + 0x80,
                                   CONCAT24(sVar89 + 0x80,CONCAT22(sVar78 + 0x80,sVar119 + 0x80)));
            local_7a0 = &local_17e8;
            local_7a8 = SIMD::(anonymous_namespace)::u16_0101_128;
            auVar44._8_8_ = uStack_17e0;
            auVar44._0_8_ = local_17e8;
            local_5b8 = 0x101010101010101;
            uStack_5b0 = 0x101010101010101;
            auVar25._8_8_ = 0x101010101010101;
            auVar25._0_8_ = 0x101010101010101;
            auVar75 = pmulhuw(auVar44,auVar25);
            local_2dc8 = auVar75._0_8_;
            uStack_2dc0 = auVar75._8_8_;
            local_1628 = s1_3 + 1;
            local_1630 = s2_1 + 1;
            local_488._0_2_ = auVar74._0_2_;
            local_488._2_2_ = auVar74._2_2_;
            local_488._4_2_ = auVar74._4_2_;
            local_488._6_2_ = auVar74._6_2_;
            uStack_480._0_2_ = auVar74._8_2_;
            uStack_480._2_2_ = auVar74._10_2_;
            uStack_480._4_2_ = auVar74._12_2_;
            uStack_480._6_2_ = auVar74._14_2_;
            local_498._0_2_ = auVar127._0_2_;
            local_498._2_2_ = auVar127._2_2_;
            local_498._4_2_ = auVar127._4_2_;
            local_498._6_2_ = auVar127._6_2_;
            uStack_490._0_2_ = auVar127._8_2_;
            uStack_490._2_2_ = auVar127._10_2_;
            uStack_490._4_2_ = auVar127._12_2_;
            uStack_490._6_2_ = auVar127._14_2_;
            s1_3[1] = CONCAT17((0 < uStack_480._6_2_) * (uStack_480._6_2_ < 0x100) * auVar74[0xe] -
                               (0xff < uStack_480._6_2_),
                               CONCAT16((0 < uStack_480._4_2_) * (uStack_480._4_2_ < 0x100) *
                                        auVar74[0xc] - (0xff < uStack_480._4_2_),
                                        CONCAT15((0 < uStack_480._2_2_) * (uStack_480._2_2_ < 0x100)
                                                 * auVar74[10] - (0xff < uStack_480._2_2_),
                                                 CONCAT14((0 < (short)uStack_480) *
                                                          ((short)uStack_480 < 0x100) * auVar74[8] -
                                                          (0xff < (short)uStack_480),
                                                          CONCAT13((0 < local_488._6_2_) *
                                                                   (local_488._6_2_ < 0x100) *
                                                                   auVar74[6] -
                                                                   (0xff < local_488._6_2_),
                                                                   CONCAT12((0 < local_488._4_2_) *
                                                                            (local_488._4_2_ < 0x100
                                                                            ) * auVar74[4] -
                                                                            (0xff < local_488._4_2_)
                                                                            ,CONCAT11((0 < local_488
                                                  ._2_2_) * (local_488._2_2_ < 0x100) * auVar74[2] -
                                                  (0xff < local_488._2_2_),
                                                  (0 < (short)local_488) *
                                                  ((short)local_488 < 0x100) * auVar74[0] -
                                                  (0xff < (short)local_488))))))));
            lStack_1530 = CONCAT17((0 < uStack_490._6_2_) * (uStack_490._6_2_ < 0x100) *
                                   auVar127[0xe] - (0xff < uStack_490._6_2_),
                                   CONCAT16((0 < uStack_490._4_2_) * (uStack_490._4_2_ < 0x100) *
                                            auVar127[0xc] - (0xff < uStack_490._4_2_),
                                            CONCAT15((0 < uStack_490._2_2_) *
                                                     (uStack_490._2_2_ < 0x100) * auVar127[10] -
                                                     (0xff < uStack_490._2_2_),
                                                     CONCAT14((0 < (short)uStack_490) *
                                                              ((short)uStack_490 < 0x100) *
                                                              auVar127[8] -
                                                              (0xff < (short)uStack_490),
                                                              CONCAT13((0 < local_498._6_2_) *
                                                                       (local_498._6_2_ < 0x100) *
                                                                       auVar127[6] -
                                                                       (0xff < local_498._6_2_),
                                                                       CONCAT12((0 < local_498._4_2_
                                                                                ) * (local_498._4_2_
                                                                                    < 0x100) *
                                                                                auVar127[4] -
                                                                                (0xff < local_498.
                                                                                        _4_2_),
                                                                                CONCAT11((0 < 
                                                  local_498._2_2_) * (local_498._2_2_ < 0x100) *
                                                  auVar127[2] - (0xff < local_498._2_2_),
                                                  (0 < (short)local_498) *
                                                  ((short)local_498 < 0x100) * auVar127[0] -
                                                  (0xff < (short)local_498))))))));
            local_1638 = s3_1 + 1;
            local_1640 = s0_6 + 1;
            local_468._0_2_ = auVar75._0_2_;
            local_468._2_2_ = auVar75._2_2_;
            local_468._4_2_ = auVar75._4_2_;
            local_468._6_2_ = auVar75._6_2_;
            uStack_460._0_2_ = auVar75._8_2_;
            uStack_460._2_2_ = auVar75._10_2_;
            uStack_460._4_2_ = auVar75._12_2_;
            uStack_460._6_2_ = auVar75._14_2_;
            local_478._0_2_ = auVar76._0_2_;
            local_478._2_2_ = auVar76._2_2_;
            local_478._4_2_ = auVar76._4_2_;
            local_478._6_2_ = auVar76._6_2_;
            uStack_470._0_2_ = auVar76._8_2_;
            uStack_470._2_2_ = auVar76._10_2_;
            uStack_470._4_2_ = auVar76._12_2_;
            uStack_470._6_2_ = auVar76._14_2_;
            s3_1[1] = CONCAT17((0 < uStack_460._6_2_) * (uStack_460._6_2_ < 0x100) * auVar75[0xe] -
                               (0xff < uStack_460._6_2_),
                               CONCAT16((0 < uStack_460._4_2_) * (uStack_460._4_2_ < 0x100) *
                                        auVar75[0xc] - (0xff < uStack_460._4_2_),
                                        CONCAT15((0 < uStack_460._2_2_) * (uStack_460._2_2_ < 0x100)
                                                 * auVar75[10] - (0xff < uStack_460._2_2_),
                                                 CONCAT14((0 < (short)uStack_460) *
                                                          ((short)uStack_460 < 0x100) * auVar75[8] -
                                                          (0xff < (short)uStack_460),
                                                          CONCAT13((0 < local_468._6_2_) *
                                                                   (local_468._6_2_ < 0x100) *
                                                                   auVar75[6] -
                                                                   (0xff < local_468._6_2_),
                                                                   CONCAT12((0 < local_468._4_2_) *
                                                                            (local_468._4_2_ < 0x100
                                                                            ) * auVar75[4] -
                                                                            (0xff < local_468._4_2_)
                                                                            ,CONCAT11((0 < local_468
                                                  ._2_2_) * (local_468._2_2_ < 0x100) * auVar75[2] -
                                                  (0xff < local_468._2_2_),
                                                  (0 < (short)local_468) *
                                                  ((short)local_468 < 0x100) * auVar75[0] -
                                                  (0xff < (short)local_468))))))));
            s2_1[0] = CONCAT17((0 < uStack_470._6_2_) * (uStack_470._6_2_ < 0x100) * auVar76[0xe] -
                               (0xff < uStack_470._6_2_),
                               CONCAT16((0 < uStack_470._4_2_) * (uStack_470._4_2_ < 0x100) *
                                        auVar76[0xc] - (0xff < uStack_470._4_2_),
                                        CONCAT15((0 < uStack_470._2_2_) * (uStack_470._2_2_ < 0x100)
                                                 * auVar76[10] - (0xff < uStack_470._2_2_),
                                                 CONCAT14((0 < (short)uStack_470) *
                                                          ((short)uStack_470 < 0x100) * auVar76[8] -
                                                          (0xff < (short)uStack_470),
                                                          CONCAT13((0 < local_478._6_2_) *
                                                                   (local_478._6_2_ < 0x100) *
                                                                   auVar76[6] -
                                                                   (0xff < local_478._6_2_),
                                                                   CONCAT12((0 < local_478._4_2_) *
                                                                            (local_478._4_2_ < 0x100
                                                                            ) * auVar76[4] -
                                                                            (0xff < local_478._4_2_)
                                                                            ,CONCAT11((0 < local_478
                                                  ._2_2_) * (local_478._2_2_ < 0x100) * auVar76[2] -
                                                  (0xff < local_478._2_2_),
                                                  (0 < (short)local_478) *
                                                  ((short)local_478 < 0x100) * auVar76[0] -
                                                  (0xff < (short)local_478))))))));
            local_1520 = (longlong *)(dstStride + local_22e0 * 4);
            *local_1520 = s1_3[1];
            local_1520[1] = lStack_1530;
            lVar64 = dstStride + local_22e0 * 4;
            local_1500 = (longlong *)(lVar64 + 0x10);
            *local_1500 = s3_1[1];
            *(longlong *)(lVar64 + 0x18) = s2_1[0];
            local_22e0 = local_22e0 + 8;
            mVal_1[1] = mVal_1[1] + -2;
            local_17c0 = local_17d0;
            local_1790 = local_17a0;
            local_1760 = local_1770;
            local_1730 = local_1740;
            local_1538 = s1_3[1];
            local_1518 = s3_1[1];
            lStack_1510 = s2_1[0];
            local_10d8 = uVar71;
            uStack_10d0 = uVar107;
            local_10c8 = (ulong)CONCAT16(uStack_d60._3_1_,
                                         (uint6)CONCAT14(uStack_d60._2_1_,
                                                         (uint)CONCAT12(uStack_d60._1_1_,
                                                                        (ushort)(byte)uStack_d60)));
            uStack_10c0 = (ulong)CONCAT16(uStack_d60._7_1_,
                                          (uint6)CONCAT14(uStack_d60._6_1_,
                                                          (uint)CONCAT12(uStack_d60._5_1_,
                                                                         (ushort)uStack_d60._4_1_)))
            ;
            local_10b8 = uVar71;
            uStack_10b0 = uVar107;
            local_10a8 = (ulong)CONCAT16(uStack_d40._3_1_,
                                         (uint6)CONCAT14(uStack_d40._2_1_,
                                                         (uint)CONCAT12(uStack_d40._1_1_,
                                                                        (ushort)(byte)uStack_d40)));
            uStack_10a0 = (ulong)CONCAT16(uStack_d40._7_1_,
                                          (uint6)CONCAT14(uStack_d40._6_1_,
                                                          (uint)CONCAT12(uStack_d40._5_1_,
                                                                         (ushort)uStack_d40._4_1_)))
            ;
            local_1098 = uVar71;
            uStack_1090 = uVar107;
            local_1088 = local_2cb8;
            uStack_1080 = uStack_2cb0;
            local_1078 = uVar71;
            uStack_1070 = uVar107;
            local_1068 = local_2cc8;
            uStack_1060 = uStack_2cc0;
            uStack_d60 = uVar7;
            uStack_d40 = uVar12;
            local_9c8 = uVar3;
            uStack_9c0 = uVar4;
            local_9a8 = uVar3;
            uStack_9a0 = uVar4;
            local_988 = uVar3;
            uStack_980 = uVar4;
            local_968 = uVar3;
            uStack_960 = uVar4;
            local_5a8 = local_17e8;
            uStack_5a0 = uStack_17e0;
            local_588 = local_17b8;
            uStack_580 = uStack_17b0;
            local_568 = local_1788;
            uStack_560 = uStack_1780;
            local_548 = local_1758;
            uStack_540 = uStack_1750;
            local_498 = local_2d68;
            uStack_490 = lStack_2d60;
            local_488 = local_2da8;
            uStack_480 = uStack_2da0;
            local_478 = local_2d88;
            uStack_470 = lStack_2d80;
            local_468 = local_2dc8;
            uStack_460 = uStack_2dc0;
          }
          if (mVal_1[1] != 0) {
            local_df0 = (undefined1 (*) [16])(dstStride + local_22e0 * 4);
            local_d88 = *(undefined8 *)*local_df0;
            uVar7 = *(undefined8 *)(*local_df0 + 8);
            local_de8 = dstStride + local_22e0 * 4 + 0x10;
            local_cb8 = 0;
            uStack_cb0 = 0;
            local_d98 = 0;
            uStack_d90 = 0;
            uStack_d80._0_1_ = (byte)uVar7;
            uStack_d80._1_1_ = (byte)((ulong)uVar7 >> 8);
            uStack_d80._2_1_ = (byte)((ulong)uVar7 >> 0x10);
            uStack_d80._3_1_ = (byte)((ulong)uVar7 >> 0x18);
            uStack_d80._4_1_ = (byte)((ulong)uVar7 >> 0x20);
            uStack_d80._5_1_ = (byte)((ulong)uVar7 >> 0x28);
            uStack_d80._6_1_ = (byte)((ulong)uVar7 >> 0x30);
            uStack_d80._7_1_ = (byte)((ulong)uVar7 >> 0x38);
            uVar14 = CONCAT16(uStack_d80._3_1_,
                              (uint6)CONCAT14(uStack_d80._2_1_,
                                              (uint)CONCAT12(uStack_d80._1_1_,
                                                             (ushort)(byte)uStack_d80)));
            uVar15 = CONCAT16(uStack_d80._7_1_,
                              (uint6)CONCAT14(uStack_d80._6_1_,
                                              (uint)CONCAT12(uStack_d80._5_1_,
                                                             (ushort)uStack_d80._4_1_)));
            auVar127 = pmovzxbw(*local_df0,local_d88);
            local_2e48 = auVar127._0_8_;
            uStack_2e40 = auVar127._8_8_;
            local_1108._2_2_ = (ushort)uStack_d80._1_1_;
            local_1108._4_2_ = (ushort)uStack_d80._2_1_;
            local_1108._6_2_ = (ushort)uStack_d80._3_1_;
            uStack_1100._2_2_ = (ushort)uStack_d80._5_1_;
            uStack_1100._4_2_ = (ushort)uStack_d80._6_1_;
            uStack_1100._6_2_ = (ushort)uStack_d80._7_1_;
            sVar67 = (ushort)(byte)uStack_d80 * (short)local_10d8;
            sVar66 = (ushort)uStack_d80._4_1_ * (short)uStack_10d0;
            local_9f8 = CONCAT26(local_1108._6_2_ * local_10d8._6_2_,
                                 CONCAT24(local_1108._4_2_ * local_10d8._4_2_,
                                          CONCAT22(local_1108._2_2_ * local_10d8._2_2_,sVar67)));
            uStack_9f0 = CONCAT26(uStack_1100._6_2_ * uStack_10d0._6_2_,
                                  CONCAT24(uStack_1100._4_2_ * uStack_10d0._4_2_,
                                           CONCAT22(uStack_1100._2_2_ * uStack_10d0._2_2_,sVar66)));
            local_10e8._0_2_ = auVar127._0_2_;
            local_10e8._2_2_ = auVar127._2_2_;
            local_10e8._4_2_ = auVar127._4_2_;
            local_10e8._6_2_ = auVar127._6_2_;
            uStack_10e0._0_2_ = auVar127._8_2_;
            uStack_10e0._2_2_ = auVar127._10_2_;
            uStack_10e0._4_2_ = auVar127._12_2_;
            uStack_10e0._6_2_ = auVar127._14_2_;
            local_9d8 = CONCAT26(local_10e8._6_2_ * local_10d8._6_2_,
                                 CONCAT24(local_10e8._4_2_ * local_10d8._4_2_,
                                          CONCAT22(local_10e8._2_2_ * local_10d8._2_2_,
                                                   (short)local_10e8 * (short)local_10d8)));
            uStack_9d0 = CONCAT26(uStack_10e0._6_2_ * uStack_10d0._6_2_,
                                  CONCAT24(uStack_10e0._4_2_ * uStack_10d0._4_2_,
                                           CONCAT22(uStack_10e0._2_2_ * uStack_10d0._2_2_,
                                                    (short)uStack_10e0 * (short)uStack_10d0)));
            sVar67 = sVar67 + (short)local_1148;
            sVar69 = local_1108._2_2_ * local_10d8._2_2_ + local_1148._2_2_;
            sVar82 = local_1108._4_2_ * local_10d8._4_2_ + local_1148._4_2_;
            sVar84 = local_1108._6_2_ * local_10d8._6_2_ + local_1148._6_2_;
            sVar66 = sVar66 + (short)uStack_1140;
            sVar81 = uStack_1100._2_2_ * uStack_10d0._2_2_ + uStack_1140._2_2_;
            sVar92 = uStack_1100._4_2_ * uStack_10d0._4_2_ + uStack_1140._4_2_;
            sVar100 = uStack_1100._6_2_ * uStack_10d0._6_2_ + uStack_1140._6_2_;
            local_c18 = CONCAT26(sVar84,CONCAT24(sVar82,CONCAT22(sVar69,sVar67)));
            uStack_c10 = CONCAT26(sVar100,CONCAT24(sVar92,CONCAT22(sVar81,sVar66)));
            sVar68 = (short)local_10e8 * (short)local_10d8 + (short)local_1148;
            sVar70 = local_10e8._2_2_ * local_10d8._2_2_ + local_1148._2_2_;
            sVar83 = local_10e8._4_2_ * local_10d8._4_2_ + local_1148._4_2_;
            sVar85 = local_10e8._6_2_ * local_10d8._6_2_ + local_1148._6_2_;
            sVar80 = (short)uStack_10e0 * (short)uStack_10d0 + (short)uStack_1140;
            sVar91 = uStack_10e0._2_2_ * uStack_10d0._2_2_ + uStack_1140._2_2_;
            sVar99 = uStack_10e0._4_2_ * uStack_10d0._4_2_ + uStack_1140._4_2_;
            sVar105 = uStack_10e0._6_2_ * uStack_10d0._6_2_ + uStack_1140._6_2_;
            local_bf8 = CONCAT26(sVar85,CONCAT24(sVar83,CONCAT22(sVar70,sVar68)));
            uStack_bf0 = CONCAT26(sVar105,CONCAT24(sVar99,CONCAT22(sVar91,sVar80)));
            local_16d0 = s0_7 + 1;
            local_16d8 = SIMD::(anonymous_namespace)::u16_0080_128;
            local_c28 = 0x80008000800080;
            uStack_c20 = 0x80008000800080;
            local_508 = CONCAT26(sVar84 + 0x80,
                                 CONCAT24(sVar82 + 0x80,CONCAT22(sVar69 + 0x80,sVar67 + 0x80)));
            uStack_500 = CONCAT26(sVar100 + 0x80,
                                  CONCAT24(sVar92 + 0x80,CONCAT22(sVar81 + 0x80,sVar66 + 0x80)));
            local_7f0 = &local_16f8;
            local_7f8 = SIMD::(anonymous_namespace)::u16_0101_128;
            auVar49._8_8_ = uStack_500;
            auVar49._0_8_ = local_508;
            local_518 = 0x101010101010101;
            uStack_510 = 0x101010101010101;
            auVar30._8_8_ = 0x101010101010101;
            auVar30._0_8_ = 0x101010101010101;
            auVar127 = pmulhuw(auVar49,auVar30);
            local_2ea8 = auVar127._0_8_;
            lStack_2ea0 = auVar127._8_8_;
            s0_7[1] = local_2ea8;
            s1_4[0] = lStack_2ea0;
            local_1700 = s1_4 + 1;
            local_1708 = SIMD::(anonymous_namespace)::u16_0080_128;
            local_c08 = 0x80008000800080;
            uStack_c00 = 0x80008000800080;
            local_528 = CONCAT26(sVar85 + 0x80,
                                 CONCAT24(sVar83 + 0x80,CONCAT22(sVar70 + 0x80,sVar68 + 0x80)));
            uStack_520 = CONCAT26(sVar105 + 0x80,
                                  CONCAT24(sVar99 + 0x80,CONCAT22(sVar91 + 0x80,sVar80 + 0x80)));
            local_7e0 = &local_1728;
            local_7e8 = SIMD::(anonymous_namespace)::u16_0101_128;
            auVar48._8_8_ = uStack_520;
            auVar48._0_8_ = local_528;
            local_538 = 0x101010101010101;
            uStack_530 = 0x101010101010101;
            auVar29._8_8_ = 0x101010101010101;
            auVar29._0_8_ = 0x101010101010101;
            auVar76 = pmulhuw(auVar48,auVar29);
            local_2ec8 = auVar76._0_8_;
            uStack_2ec0 = auVar76._8_8_;
            local_1618 = s1_4 + 1;
            local_1620 = s0_7 + 1;
            local_4a8._0_2_ = auVar76._0_2_;
            local_4a8._2_2_ = auVar76._2_2_;
            local_4a8._4_2_ = auVar76._4_2_;
            local_4a8._6_2_ = auVar76._6_2_;
            uStack_4a0._0_2_ = auVar76._8_2_;
            uStack_4a0._2_2_ = auVar76._10_2_;
            uStack_4a0._4_2_ = auVar76._12_2_;
            uStack_4a0._6_2_ = auVar76._14_2_;
            local_4b8._0_2_ = auVar127._0_2_;
            local_4b8._2_2_ = auVar127._2_2_;
            local_4b8._4_2_ = auVar127._4_2_;
            local_4b8._6_2_ = auVar127._6_2_;
            uStack_4b0._0_2_ = auVar127._8_2_;
            uStack_4b0._2_2_ = auVar127._10_2_;
            uStack_4b0._4_2_ = auVar127._12_2_;
            uStack_4b0._6_2_ = auVar127._14_2_;
            local_1558 = CONCAT17((0 < uStack_4a0._6_2_) * (uStack_4a0._6_2_ < 0x100) * auVar76[0xe]
                                  - (0xff < uStack_4a0._6_2_),
                                  CONCAT16((0 < uStack_4a0._4_2_) * (uStack_4a0._4_2_ < 0x100) *
                                           auVar76[0xc] - (0xff < uStack_4a0._4_2_),
                                           CONCAT15((0 < uStack_4a0._2_2_) *
                                                    (uStack_4a0._2_2_ < 0x100) * auVar76[10] -
                                                    (0xff < uStack_4a0._2_2_),
                                                    CONCAT14((0 < (short)uStack_4a0) *
                                                             ((short)uStack_4a0 < 0x100) *
                                                             auVar76[8] - (0xff < (short)uStack_4a0)
                                                             ,CONCAT13((0 < local_4a8._6_2_) *
                                                                       (local_4a8._6_2_ < 0x100) *
                                                                       auVar76[6] -
                                                                       (0xff < local_4a8._6_2_),
                                                                       CONCAT12((0 < local_4a8._4_2_
                                                                                ) * (local_4a8._4_2_
                                                                                    < 0x100) *
                                                                                auVar76[4] -
                                                                                (0xff < local_4a8.
                                                                                        _4_2_),
                                                                                CONCAT11((0 < 
                                                  local_4a8._2_2_) * (local_4a8._2_2_ < 0x100) *
                                                  auVar76[2] - (0xff < local_4a8._2_2_),
                                                  (0 < (short)local_4a8) *
                                                  ((short)local_4a8 < 0x100) * auVar76[0] -
                                                  (0xff < (short)local_4a8))))))));
            lStack_1550 = CONCAT17((0 < uStack_4b0._6_2_) * (uStack_4b0._6_2_ < 0x100) *
                                   auVar127[0xe] - (0xff < uStack_4b0._6_2_),
                                   CONCAT16((0 < uStack_4b0._4_2_) * (uStack_4b0._4_2_ < 0x100) *
                                            auVar127[0xc] - (0xff < uStack_4b0._4_2_),
                                            CONCAT15((0 < uStack_4b0._2_2_) *
                                                     (uStack_4b0._2_2_ < 0x100) * auVar127[10] -
                                                     (0xff < uStack_4b0._2_2_),
                                                     CONCAT14((0 < (short)uStack_4b0) *
                                                              ((short)uStack_4b0 < 0x100) *
                                                              auVar127[8] -
                                                              (0xff < (short)uStack_4b0),
                                                              CONCAT13((0 < local_4b8._6_2_) *
                                                                       (local_4b8._6_2_ < 0x100) *
                                                                       auVar127[6] -
                                                                       (0xff < local_4b8._6_2_),
                                                                       CONCAT12((0 < local_4b8._4_2_
                                                                                ) * (local_4b8._4_2_
                                                                                    < 0x100) *
                                                                                auVar127[4] -
                                                                                (0xff < local_4b8.
                                                                                        _4_2_),
                                                                                CONCAT11((0 < 
                                                  local_4b8._2_2_) * (local_4b8._2_2_ < 0x100) *
                                                  auVar127[2] - (0xff < local_4b8._2_2_),
                                                  (0 < (short)local_4b8) *
                                                  ((short)local_4b8 < 0x100) * auVar127[0] -
                                                  (0xff < (short)local_4b8))))))));
            local_1540 = (longlong *)(dstStride + local_22e0 * 4);
            *local_1540 = local_1558;
            local_1540[1] = lStack_1550;
            local_22e0 = local_22e0 + 4;
            uStack_4a0 = uStack_2ec0;
            local_4a8 = local_2ec8;
            uStack_4b0 = lStack_2ea0;
            local_4b8 = local_2ea8;
            uStack_9e0 = uVar4;
            local_9e8 = uVar3;
            uStack_a00 = uVar4;
            local_a08 = uVar3;
            uStack_d80 = uVar7;
            uStack_10e0 = uStack_2e40;
            local_10e8 = local_2e48;
            uStack_10f0 = uVar107;
            local_10f8 = uVar71;
            uStack_1100 = (ulong)uVar15;
            local_1108 = (ulong)uVar14;
            uStack_1110 = uVar107;
            local_1118 = uVar71;
            local_16e0 = local_16d0;
            uStack_16f0 = uStack_500;
            local_16f8 = local_508;
            local_1710 = local_1700;
            uStack_1720 = uStack_520;
            local_1728 = local_528;
            s0_6[0] = lStack_1550;
            s1_4[1] = local_1558;
          }
          for (; uVar7 = local_2558, uVar12 = uStack_2550, local_22e0 < uVar60;
              local_22e0 = local_22e0 + 1) {
            local_1580 = (uint *)(dstStride + local_22e0 * 4);
            local_155c = *local_1580;
            local_1578._4_4_ = 0;
            local_1578._0_4_ = local_155c;
            auVar32._8_8_ = 0;
            auVar32._0_8_ = local_1578._0_8_;
            auVar127 = pmovzxbw(auVar32,local_1578._0_8_);
            local_2ee8 = auVar127._0_8_;
            uStack_2ee0 = auVar127._8_8_;
            local_1128._0_2_ = auVar127._0_2_;
            local_1128._2_2_ = auVar127._2_2_;
            local_1128._4_2_ = auVar127._4_2_;
            local_1128._6_2_ = auVar127._6_2_;
            uStack_1120._0_2_ = auVar127._8_2_;
            uStack_1120._2_2_ = auVar127._10_2_;
            uStack_1120._4_2_ = auVar127._12_2_;
            uStack_1120._6_2_ = auVar127._14_2_;
            local_a18 = CONCAT26(local_1128._6_2_ * local_10d8._6_2_,
                                 CONCAT24(local_1128._4_2_ * local_10d8._4_2_,
                                          CONCAT22(local_1128._2_2_ * local_10d8._2_2_,
                                                   (short)local_1128 * (short)local_10d8)));
            uStack_a10 = CONCAT26(uStack_1120._6_2_ * uStack_10d0._6_2_,
                                  CONCAT24(uStack_1120._4_2_ * uStack_10d0._4_2_,
                                           CONCAT22(uStack_1120._2_2_ * uStack_10d0._2_2_,
                                                    (short)uStack_1120 * (short)uStack_10d0)));
            sVar67 = (short)local_1128 * (short)local_10d8 + (short)local_1148;
            sVar68 = local_1128._2_2_ * local_10d8._2_2_ + local_1148._2_2_;
            sVar69 = local_1128._4_2_ * local_10d8._4_2_ + local_1148._4_2_;
            sVar70 = local_1128._6_2_ * local_10d8._6_2_ + local_1148._6_2_;
            sVar82 = (short)uStack_1120 * (short)uStack_10d0 + (short)uStack_1140;
            sVar83 = uStack_1120._2_2_ * uStack_10d0._2_2_ + uStack_1140._2_2_;
            sVar84 = uStack_1120._4_2_ * uStack_10d0._4_2_ + uStack_1140._4_2_;
            sVar85 = uStack_1120._6_2_ * uStack_10d0._6_2_ + uStack_1140._6_2_;
            local_c38 = CONCAT26(sVar70,CONCAT24(sVar69,CONCAT22(sVar68,sVar67)));
            uStack_c30 = CONCAT26(sVar85,CONCAT24(sVar84,CONCAT22(sVar83,sVar82)));
            local_16b8 = &uStack_23b8;
            local_16b0 = SIMD::(anonymous_namespace)::u16_0080_128;
            local_c48 = 0x80008000800080;
            uStack_c40 = 0x80008000800080;
            local_16c8 = CONCAT26(sVar70 + 0x80,
                                  CONCAT24(sVar69 + 0x80,CONCAT22(sVar68 + 0x80,sVar67 + 0x80)));
            uStack_16c0 = CONCAT26(sVar85 + 0x80,
                                   CONCAT24(sVar84 + 0x80,CONCAT22(sVar83 + 0x80,sVar82 + 0x80)));
            local_800 = &local_16c8;
            local_808 = SIMD::(anonymous_namespace)::u16_0101_128;
            auVar50._8_8_ = uStack_16c0;
            auVar50._0_8_ = local_16c8;
            local_4f8 = 0x101010101010101;
            uStack_4f0 = 0x101010101010101;
            auVar31._8_8_ = 0x101010101010101;
            auVar31._0_8_ = 0x101010101010101;
            auVar127 = pmulhuw(auVar50,auVar31);
            local_2f28 = auVar127._0_8_;
            uStack_2f20 = auVar127._8_8_;
            local_1608 = &uStack_23b8;
            local_1610 = &uStack_23b8;
            local_4d8 = local_2f28;
            uStack_4d0 = uStack_2f20;
            local_4c8._0_2_ = auVar127._0_2_;
            local_4c8._2_2_ = auVar127._2_2_;
            local_4c8._4_2_ = auVar127._4_2_;
            local_4c8._6_2_ = auVar127._6_2_;
            uStack_4c0._0_2_ = auVar127._8_2_;
            uStack_4c0._2_2_ = auVar127._10_2_;
            uStack_4c0._4_2_ = auVar127._12_2_;
            uStack_4c0._6_2_ = auVar127._14_2_;
            uVar13 = CONCAT13((0 < local_4c8._6_2_) * (local_4c8._6_2_ < 0x100) * auVar127[6] -
                              (0xff < local_4c8._6_2_),
                              CONCAT12((0 < local_4c8._4_2_) * (local_4c8._4_2_ < 0x100) *
                                       auVar127[4] - (0xff < local_4c8._4_2_),
                                       CONCAT11((0 < local_4c8._2_2_) * (local_4c8._2_2_ < 0x100) *
                                                auVar127[2] - (0xff < local_4c8._2_2_),
                                                (0 < (short)local_4c8) * ((short)local_4c8 < 0x100)
                                                * auVar127[0] - (0xff < (short)local_4c8))));
            uStack_23b8 = CONCAT17((0 < uStack_4c0._6_2_) * (uStack_4c0._6_2_ < 0x100) *
                                   auVar127[0xe] - (0xff < uStack_4c0._6_2_),
                                   CONCAT16((0 < uStack_4c0._4_2_) * (uStack_4c0._4_2_ < 0x100) *
                                            auVar127[0xc] - (0xff < uStack_4c0._4_2_),
                                            CONCAT15((0 < uStack_4c0._2_2_) *
                                                     (uStack_4c0._2_2_ < 0x100) * auVar127[10] -
                                                     (0xff < uStack_4c0._2_2_),
                                                     CONCAT14((0 < (short)uStack_4c0) *
                                                              ((short)uStack_4c0 < 0x100) *
                                                              auVar127[8] -
                                                              (0xff < (short)uStack_4c0),uVar13))));
            s0_7[0] = CONCAT17((0 < uStack_4c0._6_2_) * (uStack_4c0._6_2_ < 0x100) * auVar127[0xe] -
                               (0xff < uStack_4c0._6_2_),
                               CONCAT16((0 < uStack_4c0._4_2_) * (uStack_4c0._4_2_ < 0x100) *
                                        auVar127[0xc] - (0xff < uStack_4c0._4_2_),
                                        CONCAT15((0 < uStack_4c0._2_2_) * (uStack_4c0._2_2_ < 0x100)
                                                 * auVar127[10] - (0xff < uStack_4c0._2_2_),
                                                 CONCAT14((0 < (short)uStack_4c0) *
                                                          ((short)uStack_4c0 < 0x100) * auVar127[8]
                                                          - (0xff < (short)uStack_4c0),
                                                          CONCAT13((0 < local_4c8._6_2_) *
                                                                   (local_4c8._6_2_ < 0x100) *
                                                                   auVar127[6] -
                                                                   (0xff < local_4c8._6_2_),
                                                                   CONCAT12((0 < local_4c8._4_2_) *
                                                                            (local_4c8._4_2_ < 0x100
                                                                            ) * auVar127[4] -
                                                                            (0xff < local_4c8._4_2_)
                                                                            ,CONCAT11((0 < local_4c8
                                                  ._2_2_) * (local_4c8._2_2_ < 0x100) * auVar127[2]
                                                  - (0xff < local_4c8._2_2_),
                                                  (0 < (short)local_4c8) *
                                                  ((short)local_4c8 < 0x100) * auVar127[0] -
                                                  (0xff < (short)local_4c8))))))));
            *(undefined4 *)(dstStride + local_22e0 * 4) = uVar13;
            local_16a8 = local_16b8;
            local_1578 = ZEXT416(local_155c);
            local_11f8 = uStack_23b8;
            lStack_11f0 = s0_7[0];
            local_11e8 = uStack_23b8;
            lStack_11e0 = s0_7[0];
            local_1138 = uVar71;
            uStack_1130 = uVar107;
            local_1128 = local_2ee8;
            uStack_1120 = uStack_2ee0;
            local_a28 = uVar3;
            uStack_a20 = uVar4;
            local_4e8 = local_16c8;
            uStack_4e0 = uStack_16c0;
            local_4c8 = local_2f28;
            uStack_4c0 = uStack_2f20;
          }
        }
      }
    }
    uStack_10d0 = uVar72;
    local_10d8 = uVar53;
    uStack_1140 = uVar12;
    local_1148 = uVar7;
    dstStride = iVar58 + dstStride;
    compositor._u32[1] = *(long *)(this + 0x58) * 8 + compositor._u32[1];
    y1 = y1 + 1;
    lVar6 = s0_3[1];
    lVar51 = m1[0];
    lVar52 = m1[1];
  } while( true );
}

Assistant:

inline void RasterizerA3<N>::_renderImpl(uint32_t argb32) noexcept {
  uint8_t* dstLine = _dst->data();
  intptr_t dstStride = _dst->stride();

  size_t y0 = size_t(_yBounds.start);
  size_t y1 = size_t(_yBounds.end);

  BitWord* bitPtr = _bits + y0 * _bitStride;
  Cell* cellLine = _cells + y0 * _cellStride;

  Compositor compositor(argb32);
  dstLine += y0 * dstStride;

  while (y0 <= y1) {
    size_t nBits = size_t(_bitStride);

    Cell* cell = cellLine;
    uint32_t* dstPix = reinterpret_cast<uint32_t*>(dstLine);

    int cover = 0;
    size_t x0 = 0;
    size_t xOffset = 0;

    do {
      IntUtils::BitWordFlipIterator<BitWord> it(*bitPtr);
      *bitPtr = 0;

      while (it.hasNext()) {
        size_t x1 = xOffset + it.nextAndFlip() * kPixelsPerOneBit;
        if (x0 < x1) {
          uint32_t mask = CompositeUtils::calcMask<NonZero>(cover);
          if (mask)
            compositor.cmask(dstPix, x0, x1, mask);
          x0 = x1;
        }

        if (it.hasNext())
          x1 = xOffset + it.nextAndFlip() * kPixelsPerOneBit;
        else
          x1 = std::min<size_t>(_width, xOffset + kPixelsPerBitWord);

        compositor.template vmask<NonZero>(dstPix, x0, x1, cell, cover);
        x0 = x1;
      }

      xOffset += kPixelsPerBitWord;
      bitPtr++;
    } while (--nBits);

    if (x0 < _width) {
      uint32_t mask = CompositeUtils::calcMask<NonZero>(cover);
      if (mask)
        compositor.cmask(dstPix, x0, _width, mask);
    }

    dstLine += dstStride;
    cellLine += _cellStride;
    y0++;
  }

  _yBounds.reset();
}